

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O3

void compute_response_layers_at_once(fasthessian *fh)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  response_layer *prVar13;
  response_layer *prVar14;
  response_layer *prVar15;
  response_layer *prVar16;
  response_layer *prVar17;
  response_layer *prVar18;
  response_layer *prVar19;
  response_layer *prVar20;
  float *pfVar21;
  bool *pbVar22;
  integral_image *piVar23;
  float *pfVar24;
  bool *pbVar25;
  float *pfVar26;
  bool *pbVar27;
  float *pfVar28;
  bool *pbVar29;
  float *pfVar30;
  bool *pbVar31;
  float *pfVar32;
  bool *pbVar33;
  float *pfVar34;
  bool *pbVar35;
  float *pfVar36;
  bool *pbVar37;
  float *pfVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  int iVar120;
  int iVar121;
  int iVar122;
  int iVar123;
  int iVar124;
  int iVar125;
  int iVar126;
  int iVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  int iVar132;
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  int iVar145;
  int iVar146;
  int iVar147;
  uint uVar148;
  long lVar149;
  int width;
  int iVar150;
  int iVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  int iVar157;
  int iVar158;
  int iVar159;
  int iVar160;
  int iVar161;
  int iVar162;
  int iVar163;
  int iVar164;
  int iVar165;
  int iVar166;
  int iVar167;
  int iVar168;
  int iVar169;
  int iVar170;
  int iVar171;
  int iVar172;
  int iVar173;
  bool bVar174;
  int iVar175;
  int iVar176;
  int iVar177;
  int iVar178;
  int iVar179;
  int iVar180;
  int iVar181;
  int iVar182;
  int iVar183;
  int iVar184;
  int iVar185;
  int iVar186;
  int iVar187;
  int iVar188;
  int iVar189;
  bool bVar190;
  int iVar191;
  int iVar192;
  int iVar193;
  int c1;
  int iVar194;
  int iVar195;
  int iVar196;
  int iVar197;
  int iVar198;
  int iVar199;
  int iVar200;
  int iVar201;
  int iVar202;
  int iVar203;
  int iVar204;
  int iVar205;
  int iVar206;
  float *data;
  int iVar207;
  long lVar208;
  int c0;
  int iVar209;
  int iVar210;
  int iVar211;
  int iVar212;
  int iVar213;
  int iVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar246 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM27 [64];
  undefined1 in_ZMM28 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  undefined1 in_ZMM31 [64];
  uint local_734;
  int local_690;
  
  prVar13 = fh->response_map[0];
  uVar1 = prVar13->height;
  if (0 < (int)uVar1) {
    prVar14 = fh->response_map[1];
    prVar15 = fh->response_map[3];
    iVar2 = prVar13->filter_size;
    prVar16 = fh->response_map[2];
    prVar17 = fh->response_map[4];
    auVar246 = ZEXT816(0) << 0x40;
    iVar176 = 0;
    iVar182 = 0;
    local_690 = 0;
    local_734 = 0;
    iVar3 = prVar14->filter_size;
    iVar4 = prVar15->filter_size;
    iVar5 = prVar16->filter_size;
    iVar43 = iVar2 / 3;
    iVar44 = iVar3 / 3;
    iVar45 = iVar5 / 3;
    iVar46 = iVar4 / 3;
    iVar6 = prVar17->filter_size;
    iVar47 = iVar6 / 3;
    prVar18 = fh->response_map[5];
    iVar7 = prVar18->filter_size;
    iVar48 = iVar7 / 3;
    prVar19 = fh->response_map[6];
    fVar240 = 1.0 / (float)(iVar5 * iVar5);
    iVar8 = prVar19->filter_size;
    iVar49 = iVar8 / 3;
    prVar20 = fh->response_map[7];
    fVar242 = 1.0 / (float)(iVar6 * iVar6);
    fVar239 = 1.0 / (float)(iVar3 * iVar3);
    iVar9 = prVar20->filter_size;
    fVar241 = 1.0 / (float)(iVar4 * iVar4);
    fVar243 = 1.0 / (float)(iVar7 * iVar7);
    fVar244 = 1.0 / (float)(iVar8 * iVar8);
    iVar50 = iVar9 / 3;
    fVar238 = 1.0 / (float)(iVar2 * iVar2);
    iVar51 = iVar2 / 6;
    fVar245 = 1.0 / (float)(iVar9 * iVar9);
    iVar52 = iVar3 / 6;
    iVar53 = iVar5 / 6;
    iVar54 = iVar4 / 6;
    pfVar21 = prVar13->response;
    iVar55 = iVar6 / 6;
    iVar56 = iVar7 / 6;
    iVar57 = iVar8 / 6;
    iVar58 = iVar9 / 6;
    iVar10 = fh->step;
    pbVar22 = prVar13->laplacian;
    piVar23 = fh->iimage;
    iVar11 = prVar13->width;
    pfVar24 = prVar14->response;
    pbVar25 = prVar14->laplacian;
    pfVar26 = prVar16->response;
    pbVar27 = prVar16->laplacian;
    pfVar28 = prVar15->response;
    pbVar29 = prVar15->laplacian;
    pfVar30 = prVar17->response;
    pbVar31 = prVar17->laplacian;
    pfVar32 = prVar18->response;
    pbVar33 = prVar18->laplacian;
    pfVar34 = prVar19->response;
    pbVar35 = prVar19->laplacian;
    pfVar36 = prVar20->response;
    pbVar37 = prVar20->laplacian;
    iVar205 = (iVar2 + -1) - (iVar2 + -1 >> 0x1f) >> 1;
    iVar96 = (iVar3 + -1) - (iVar3 + -1 >> 0x1f) >> 1;
    iVar150 = (iVar5 + -1) - (iVar5 + -1 >> 0x1f) >> 1;
    iVar177 = (iVar4 + -1) - (iVar4 + -1 >> 0x1f) >> 1;
    iVar183 = (iVar6 + -1) - (iVar6 + -1 >> 0x1f) >> 1;
    iVar191 = (iVar7 + -1) - (iVar7 + -1 >> 0x1f) >> 1;
    iVar194 = (iVar8 + -1) - (iVar8 + -1 >> 0x1f) >> 1;
    iVar93 = (iVar9 + -1) - (iVar9 + -1 >> 0x1f) >> 1;
    do {
      if (0 < iVar11) {
        iVar97 = local_734 * iVar10;
        iVar146 = piVar23->data_width;
        iVar12 = piVar23->height;
        iVar178 = iVar97 - iVar43;
        iVar151 = iVar43 * 2 + iVar178;
        iVar85 = iVar178 + 1;
        if (iVar12 < iVar178 + 1) {
          iVar85 = iVar12;
        }
        if (iVar12 <= iVar151) {
          iVar151 = iVar12;
        }
        iVar184 = (iVar85 + -1) * iVar146;
        iVar152 = (iVar151 + -1) * iVar146;
        iVar153 = iVar97 - iVar205;
        iVar59 = iVar153;
        if (iVar12 < iVar153) {
          iVar59 = iVar12;
        }
        iVar60 = iVar153 + iVar2;
        if (iVar12 <= iVar153 + iVar2) {
          iVar60 = iVar12;
        }
        iVar185 = (iVar59 + -1) * iVar146;
        iVar154 = (iVar60 + -1) * iVar146;
        iVar155 = iVar97 - iVar51;
        iVar153 = iVar155;
        if (iVar12 < iVar155) {
          iVar153 = iVar12;
        }
        iVar61 = iVar155 + iVar43;
        if (iVar12 <= iVar155 + iVar43) {
          iVar61 = iVar12;
        }
        iVar186 = (iVar153 + -1) * iVar146;
        iVar155 = (iVar61 + -1) * iVar146;
        if (iVar12 < iVar178) {
          iVar178 = iVar12;
        }
        iVar62 = iVar12;
        if (iVar97 < iVar12) {
          iVar62 = iVar97;
        }
        iVar179 = iVar97 + 1 + iVar43;
        iVar156 = (iVar178 + -1) * iVar146;
        iVar157 = (iVar62 + -1) * iVar146;
        iVar63 = iVar97 + 1;
        if (iVar12 < iVar97 + 1) {
          iVar63 = iVar12;
        }
        if (iVar12 <= iVar179) {
          iVar179 = iVar12;
        }
        iVar158 = (iVar63 + -1) * iVar146;
        iVar159 = (iVar179 + -1) * iVar146;
        iVar160 = iVar97 + 1 + iVar44;
        iVar161 = iVar97 + 1 + iVar45;
        iVar162 = iVar97 + 1 + iVar46;
        iVar163 = iVar97 + 1 + iVar47;
        iVar164 = iVar97 + 1 + iVar48;
        iVar165 = iVar97 + 1 + iVar49;
        iVar166 = iVar97 + 1 + iVar50;
        iVar198 = iVar97 - iVar44;
        iVar86 = iVar198 + 1;
        if (iVar12 < iVar198 + 1) {
          iVar86 = iVar12;
        }
        iVar98 = iVar44 * 2 + iVar198;
        if (iVar12 <= iVar98) {
          iVar98 = iVar12;
        }
        iVar210 = (iVar86 + -1) * iVar146;
        iVar99 = (iVar98 + -1) * iVar146;
        iVar211 = iVar97 - iVar96;
        iVar64 = iVar211;
        if (iVar12 < iVar211) {
          iVar64 = iVar12;
        }
        iVar65 = iVar211 + iVar3;
        if (iVar12 <= iVar211 + iVar3) {
          iVar65 = iVar12;
        }
        iVar100 = (iVar64 + -1) * iVar146;
        iVar212 = iVar97 - iVar52;
        iVar101 = (iVar65 + -1) * iVar146;
        iVar211 = iVar212;
        if (iVar12 < iVar212) {
          iVar211 = iVar12;
        }
        iVar66 = iVar212 + iVar44;
        if (iVar12 <= iVar212 + iVar44) {
          iVar66 = iVar12;
        }
        iVar212 = (iVar211 + -1) * iVar146;
        iVar102 = (iVar66 + -1) * iVar146;
        if (iVar12 < iVar198) {
          iVar198 = iVar12;
        }
        iVar103 = (iVar198 + -1) * iVar146;
        if (iVar12 <= iVar160) {
          iVar160 = iVar12;
        }
        iVar213 = iVar97 - iVar45;
        iVar104 = (iVar160 + -1) * iVar146;
        iVar87 = iVar213 + 1;
        if (iVar12 < iVar213 + 1) {
          iVar87 = iVar12;
        }
        iVar105 = iVar45 * 2 + iVar213;
        if (iVar12 <= iVar105) {
          iVar105 = iVar12;
        }
        iVar199 = (iVar87 + -1) * iVar146;
        iVar106 = (iVar105 + -1) * iVar146;
        iVar200 = iVar97 - iVar150;
        iVar67 = iVar200;
        if (iVar12 < iVar200) {
          iVar67 = iVar12;
        }
        iVar68 = iVar200 + iVar5;
        if (iVar12 <= iVar200 + iVar5) {
          iVar68 = iVar12;
        }
        iVar107 = (iVar67 + -1) * iVar146;
        iVar167 = iVar97 - iVar53;
        iVar108 = (iVar68 + -1) * iVar146;
        iVar200 = iVar167;
        if (iVar12 < iVar167) {
          iVar200 = iVar12;
        }
        iVar69 = iVar167 + iVar45;
        if (iVar12 <= iVar167 + iVar45) {
          iVar69 = iVar12;
        }
        iVar167 = (iVar200 + -1) * iVar146;
        iVar109 = (iVar69 + -1) * iVar146;
        if (iVar12 < iVar213) {
          iVar213 = iVar12;
        }
        iVar110 = (iVar213 + -1) * iVar146;
        if (iVar12 <= iVar161) {
          iVar161 = iVar12;
        }
        iVar214 = iVar97 - iVar46;
        iVar111 = (iVar161 + -1) * iVar146;
        iVar88 = iVar214 + 1;
        if (iVar12 < iVar214 + 1) {
          iVar88 = iVar12;
        }
        iVar112 = iVar46 * 2 + iVar214;
        if (iVar12 <= iVar112) {
          iVar112 = iVar12;
        }
        iVar168 = iVar97 - iVar177;
        iVar201 = (iVar88 + -1) * iVar146;
        iVar113 = (iVar112 + -1) * iVar146;
        iVar70 = iVar168;
        if (iVar12 < iVar168) {
          iVar70 = iVar12;
        }
        iVar71 = iVar168 + iVar4;
        if (iVar12 <= iVar168 + iVar4) {
          iVar71 = iVar12;
        }
        iVar114 = (iVar70 + -1) * iVar146;
        iVar169 = iVar97 - iVar54;
        iVar115 = (iVar71 + -1) * iVar146;
        iVar168 = iVar169;
        if (iVar12 < iVar169) {
          iVar168 = iVar12;
        }
        iVar72 = iVar169 + iVar46;
        if (iVar12 <= iVar169 + iVar46) {
          iVar72 = iVar12;
        }
        iVar169 = (iVar168 + -1) * iVar146;
        iVar116 = (iVar72 + -1) * iVar146;
        if (iVar12 < iVar214) {
          iVar214 = iVar12;
        }
        iVar117 = (iVar214 + -1) * iVar146;
        if (iVar12 <= iVar162) {
          iVar162 = iVar12;
        }
        iVar170 = iVar97 - iVar47;
        iVar118 = (iVar162 + -1) * iVar146;
        iVar89 = iVar170 + 1;
        if (iVar12 < iVar170 + 1) {
          iVar89 = iVar12;
        }
        iVar119 = iVar47 * 2 + iVar170;
        if (iVar12 <= iVar119) {
          iVar119 = iVar12;
        }
        iVar180 = iVar97 - iVar183;
        iVar202 = (iVar89 + -1) * iVar146;
        iVar120 = (iVar119 + -1) * iVar146;
        iVar73 = iVar180;
        if (iVar12 < iVar180) {
          iVar73 = iVar12;
        }
        iVar74 = iVar180 + iVar6;
        if (iVar12 <= iVar180 + iVar6) {
          iVar74 = iVar12;
        }
        iVar121 = (iVar73 + -1) * iVar146;
        iVar207 = iVar97 - iVar55;
        iVar122 = (iVar74 + -1) * iVar146;
        iVar180 = iVar207;
        if (iVar12 < iVar207) {
          iVar180 = iVar12;
        }
        iVar75 = iVar207 + iVar47;
        if (iVar12 <= iVar207 + iVar47) {
          iVar75 = iVar12;
        }
        iVar207 = (iVar180 + -1) * iVar146;
        iVar123 = (iVar75 + -1) * iVar146;
        if (iVar12 < iVar170) {
          iVar170 = iVar12;
        }
        iVar124 = (iVar170 + -1) * iVar146;
        if (iVar12 <= iVar163) {
          iVar163 = iVar12;
        }
        iVar171 = iVar97 - iVar48;
        iVar125 = (iVar163 + -1) * iVar146;
        iVar90 = iVar171 + 1;
        if (iVar12 < iVar171 + 1) {
          iVar90 = iVar12;
        }
        iVar126 = iVar48 * 2 + iVar171;
        if (iVar12 <= iVar126) {
          iVar126 = iVar12;
        }
        iVar209 = iVar97 - iVar191;
        iVar203 = (iVar90 + -1) * iVar146;
        iVar127 = (iVar126 + -1) * iVar146;
        iVar76 = iVar209;
        if (iVar12 < iVar209) {
          iVar76 = iVar12;
        }
        iVar77 = iVar209 + iVar7;
        if (iVar12 <= iVar209 + iVar7) {
          iVar77 = iVar12;
        }
        iVar128 = (iVar76 + -1) * iVar146;
        iVar195 = iVar97 - iVar56;
        iVar129 = (iVar77 + -1) * iVar146;
        iVar209 = iVar195;
        if (iVar12 < iVar195) {
          iVar209 = iVar12;
        }
        iVar78 = iVar195 + iVar48;
        if (iVar12 <= iVar195 + iVar48) {
          iVar78 = iVar12;
        }
        iVar195 = (iVar209 + -1) * iVar146;
        iVar130 = (iVar78 + -1) * iVar146;
        if (iVar12 < iVar171) {
          iVar171 = iVar12;
        }
        iVar131 = (iVar171 + -1) * iVar146;
        if (iVar12 <= iVar164) {
          iVar164 = iVar12;
        }
        iVar172 = iVar97 - iVar49;
        iVar132 = (iVar164 + -1) * iVar146;
        iVar91 = iVar172 + 1;
        if (iVar12 < iVar172 + 1) {
          iVar91 = iVar12;
        }
        iVar133 = iVar49 * 2 + iVar172;
        if (iVar12 <= iVar133) {
          iVar133 = iVar12;
        }
        iVar175 = iVar97 - iVar194;
        iVar196 = (iVar91 + -1) * iVar146;
        iVar134 = (iVar133 + -1) * iVar146;
        iVar79 = iVar175;
        if (iVar12 < iVar175) {
          iVar79 = iVar12;
        }
        iVar80 = iVar175 + iVar8;
        if (iVar12 <= iVar175 + iVar8) {
          iVar80 = iVar12;
        }
        iVar135 = (iVar79 + -1) * iVar146;
        iVar187 = iVar97 - iVar57;
        iVar136 = (iVar80 + -1) * iVar146;
        iVar175 = iVar187;
        if (iVar12 < iVar187) {
          iVar175 = iVar12;
        }
        iVar81 = iVar187 + iVar49;
        if (iVar12 <= iVar187 + iVar49) {
          iVar81 = iVar12;
        }
        iVar187 = (iVar175 + -1) * iVar146;
        iVar137 = (iVar81 + -1) * iVar146;
        if (iVar12 < iVar172) {
          iVar172 = iVar12;
        }
        iVar138 = (iVar172 + -1) * iVar146;
        if (iVar12 <= iVar165) {
          iVar165 = iVar12;
        }
        iVar173 = iVar97 - iVar50;
        iVar139 = (iVar165 + -1) * iVar146;
        iVar92 = iVar173 + 1;
        if (iVar12 < iVar173 + 1) {
          iVar92 = iVar12;
        }
        iVar140 = iVar50 * 2 + iVar173;
        if (iVar12 <= iVar140) {
          iVar140 = iVar12;
        }
        iVar206 = iVar97 - iVar93;
        iVar188 = (iVar92 + -1) * iVar146;
        iVar141 = (iVar140 + -1) * iVar146;
        iVar82 = iVar206;
        if (iVar12 < iVar206) {
          iVar82 = iVar12;
        }
        iVar83 = iVar206 + iVar9;
        if (iVar12 <= iVar206 + iVar9) {
          iVar83 = iVar12;
        }
        iVar142 = (iVar82 + -1) * iVar146;
        iVar97 = iVar97 - iVar58;
        iVar143 = (iVar83 + -1) * iVar146;
        iVar206 = iVar97;
        if (iVar12 < iVar97) {
          iVar206 = iVar12;
        }
        iVar84 = iVar97 + iVar50;
        if (iVar12 <= iVar97 + iVar50) {
          iVar84 = iVar12;
        }
        iVar97 = (iVar206 + -1) * iVar146;
        iVar144 = (iVar84 + -1) * iVar146;
        if (iVar12 < iVar173) {
          iVar173 = iVar12;
        }
        iVar145 = (iVar173 + -1) * iVar146;
        if (iVar166 < iVar12) {
          iVar12 = iVar166;
        }
        iVar189 = 0;
        lVar208 = 0;
        iVar146 = (iVar12 + -1) * iVar146;
        lVar149 = (long)local_690;
        pfVar38 = piVar23->data;
        iVar166 = piVar23->width;
        do {
          fVar247 = 0.0;
          fVar251 = 0.0;
          iVar181 = iVar189 - iVar205;
          if (iVar166 < iVar189 - iVar205) {
            iVar181 = iVar166;
          }
          iVar94 = (iVar2 - iVar205) + iVar189;
          if (iVar166 <= iVar94) {
            iVar94 = iVar166;
          }
          if ((0 < iVar85) && (0 < iVar181)) {
            fVar251 = pfVar38[iVar184 + iVar181 + -1];
          }
          if ((0 < iVar85) && (0 < iVar94)) {
            fVar247 = pfVar38[iVar184 + iVar94 + -1];
          }
          fVar249 = 0.0;
          fVar250 = 0.0;
          if ((0 < iVar151) && (0 < iVar181)) {
            fVar250 = pfVar38[iVar181 + -1 + iVar152];
          }
          if ((0 < iVar151) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar94 + -1 + iVar152];
          }
          auVar215 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          auVar220 = ZEXT816(0) << 0x40;
          iVar181 = iVar189 - iVar51;
          if (iVar166 < iVar189 - iVar51) {
            iVar181 = iVar166;
          }
          iVar94 = (iVar43 - iVar51) + iVar189;
          if (iVar166 <= iVar94) {
            iVar94 = iVar166;
          }
          if ((0 < iVar85) && (0 < iVar181)) {
            auVar220 = ZEXT416((uint)pfVar38[iVar184 + iVar181 + -1]);
          }
          auVar216 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          if ((0 < iVar85) && (0 < iVar94)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar184 + iVar94 + -1]);
          }
          auVar217 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          auVar218 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          if ((0 < iVar151) && (0 < iVar181)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar181 + -1 + iVar152]);
          }
          if ((0 < iVar151) && (0 < iVar94)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar152]);
          }
          fVar248 = 0.0;
          iVar181 = -iVar43 + 1 + iVar189;
          if (iVar166 < iVar181) {
            iVar181 = iVar166;
          }
          auVar219 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar247) - fVar250) + fVar249)),
                                    auVar215);
          auVar220 = vsubss_avx512f(auVar220,auVar216);
          iVar94 = iVar43 + iVar189;
          if (iVar166 <= iVar43 + iVar189) {
            iVar94 = iVar166;
          }
          iVar147 = iVar181 + -1;
          auVar220 = vsubss_avx512f(auVar220,auVar218);
          auVar220 = vaddss_avx512f(auVar220,auVar217);
          auVar220 = vmaxss_avx(auVar220,ZEXT816(0) << 0x40);
          auVar237 = SUB6416(ZEXT464(0xc0400000),0);
          auVar220 = vfmadd132ss_fma(auVar220,auVar219,auVar237);
          fVar251 = 0.0;
          if ((0 < iVar59) && (0 < iVar181)) {
            fVar251 = pfVar38[iVar185 + iVar147];
          }
          iVar192 = iVar94 + -1;
          if ((0 < iVar59) && (0 < iVar94)) {
            fVar248 = pfVar38[iVar185 + iVar192];
          }
          fVar250 = 0.0;
          fVar247 = 0.0;
          if ((0 < iVar60) && (0 < iVar181)) {
            fVar247 = pfVar38[iVar154 + iVar147];
          }
          if ((0 < iVar60) && (0 < iVar94)) {
            fVar250 = pfVar38[iVar154 + iVar192];
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          if ((0 < iVar153) && (0 < iVar181)) {
            auVar215 = ZEXT416((uint)pfVar38[iVar186 + iVar147]);
          }
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          if ((0 < iVar153) && (0 < iVar94)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar186 + iVar192]);
          }
          auVar218 = vxorps_avx512vl(auVar218,auVar218);
          auVar219 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          if ((0 < iVar61) && (0 < iVar181)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar147 + iVar155]);
          }
          if ((0 < iVar61) && (0 < iVar94)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar192 + iVar155]);
          }
          iVar94 = iVar189 + 1 + iVar43;
          fVar249 = 0.0;
          iVar181 = iVar189 + 1;
          if (iVar166 < iVar189 + 1) {
            iVar181 = iVar166;
          }
          if (iVar166 <= iVar94) {
            iVar94 = iVar166;
          }
          iVar147 = iVar181 + -1;
          auVar221 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar248) - fVar247) + fVar250)),
                                    auVar216);
          auVar222 = vsubss_avx512f(auVar215,auVar217);
          auVar222 = vsubss_avx512f(auVar222,auVar219);
          auVar222 = vaddss_avx512f(auVar222,auVar218);
          auVar222 = vmaxss_avx(auVar222,ZEXT816(0) << 0x40);
          auVar222 = vfmadd132ss_fma(auVar222,auVar221,auVar237);
          fVar251 = 0.0;
          if ((0 < iVar178) && (0 < iVar181)) {
            fVar251 = pfVar38[iVar156 + iVar147];
          }
          iVar192 = iVar94 + -1;
          if ((0 < iVar178) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar156 + iVar192];
          }
          fVar247 = 0.0;
          auVar215 = vxorps_avx512vl(auVar215,auVar215);
          bVar190 = 0 < iVar62 && 0 < iVar181;
          if (0 < iVar62 && 0 < iVar181) {
            auVar215 = ZEXT416((uint)pfVar38[iVar157 + iVar147]);
          }
          if ((0 < iVar62) && (0 < iVar94)) {
            fVar247 = pfVar38[iVar157 + iVar192];
          }
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          iVar193 = -iVar43 + iVar189;
          if (iVar166 < iVar193) {
            iVar193 = iVar166;
          }
          iVar204 = iVar166;
          if (iVar189 < iVar166) {
            iVar204 = iVar189;
          }
          iVar95 = iVar193 + -1;
          if ((0 < iVar63) && (0 < iVar193)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar158 + iVar95]);
          }
          iVar197 = iVar204 + -1;
          auVar218 = vxorps_avx512vl(auVar218,auVar218);
          bVar174 = 0 < iVar204 && 0 < iVar63;
          if (0 < iVar204 && 0 < iVar63) {
            auVar218 = ZEXT416((uint)pfVar38[iVar158 + iVar197]);
          }
          auVar219 = vxorps_avx512vl(auVar219,auVar219);
          auVar221 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          if ((0 < iVar179) && (0 < iVar193)) {
            auVar221 = ZEXT416((uint)pfVar38[iVar159 + iVar95]);
          }
          if ((0 < iVar179) && (0 < iVar204)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar159 + iVar197]);
          }
          auVar223 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar223);
          auVar224 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          if ((0 < iVar178) && (0 < iVar193)) {
            auVar224 = ZEXT416((uint)pfVar38[iVar156 + iVar95]);
          }
          auVar225 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          if ((0 < iVar178) && (0 < iVar204)) {
            auVar225 = ZEXT416((uint)pfVar38[iVar156 + iVar197]);
          }
          auVar226 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
          auVar227 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
          if ((0 < iVar62) && (0 < iVar193)) {
            auVar227 = ZEXT416((uint)pfVar38[iVar95 + iVar157]);
          }
          bVar39 = 0 < iVar204;
          bVar40 = 0 < iVar62;
          if (bVar40 && bVar39) {
            auVar226 = ZEXT416((uint)pfVar38[iVar157 + iVar197]);
          }
          auVar228 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
          in_ZMM27 = ZEXT1664(auVar228);
          auVar229 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
          bVar41 = 0 < iVar181;
          bVar42 = 0 < iVar63;
          if (bVar42 && bVar41) {
            auVar229 = ZEXT416((uint)pfVar38[iVar158 + iVar147]);
          }
          auVar230 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
          if ((0 < iVar63) && (0 < iVar94)) {
            auVar230 = ZEXT416((uint)pfVar38[iVar158 + iVar192]);
          }
          auVar231 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
          auVar232 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
          if ((0 < iVar179) && (0 < iVar181)) {
            auVar232 = ZEXT416((uint)pfVar38[iVar159 + iVar147]);
          }
          if ((0 < iVar179) && (0 < iVar94)) {
            auVar231 = ZEXT416((uint)pfVar38[iVar192 + iVar159]);
          }
          auVar233 = vsubss_avx512f(auVar217,auVar218);
          auVar234 = vsubss_avx512f(ZEXT416((uint)(fVar251 - fVar249)),auVar215);
          auVar233 = vsubss_avx512f(auVar233,auVar221);
          auVar233 = vaddss_avx512f(auVar233,auVar219);
          auVar234 = vmaxss_avx512f(ZEXT416((uint)(auVar234._0_4_ + fVar247)),auVar216);
          auVar235 = vmaxss_avx512f(auVar233,auVar223);
          auVar233 = vsubss_avx512f(auVar224,auVar225);
          auVar233 = vsubss_avx512f(auVar233,auVar227);
          auVar233 = vaddss_avx512f(auVar233,auVar226);
          auVar236 = vmaxss_avx512f(auVar233,auVar228);
          auVar233 = vsubss_avx512f(auVar229,auVar230);
          auVar233 = vsubss_avx512f(auVar233,auVar232);
          auVar233 = vaddss_avx512f(auVar233,auVar231);
          fVar247 = 0.0;
          auVar233 = vmaxss_avx(auVar233,ZEXT816(0) << 0x20);
          fVar251 = ((auVar234._0_4_ + auVar235._0_4_) - auVar236._0_4_) - auVar233._0_4_;
          auVar233 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar251 * -0.81)),auVar220,auVar222);
          fVar251 = 0.0;
          pfVar21[lVar149 + lVar208] = auVar233._0_4_ * fVar238 * fVar238;
          pbVar22[lVar208 + lVar149] = 0.0 <= auVar220._0_4_ + auVar222._0_4_;
          iVar94 = iVar189 - iVar96;
          if (iVar166 < iVar189 - iVar96) {
            iVar94 = iVar166;
          }
          iVar192 = (iVar3 - iVar96) + iVar189;
          if (iVar166 <= iVar192) {
            iVar192 = iVar166;
          }
          if ((0 < iVar86) && (0 < iVar94)) {
            fVar251 = pfVar38[iVar210 + iVar94 + -1];
          }
          if ((0 < iVar86) && (0 < iVar192)) {
            fVar247 = pfVar38[iVar210 + iVar192 + -1];
          }
          fVar249 = 0.0;
          fVar250 = 0.0;
          if ((0 < iVar98) && (0 < iVar94)) {
            fVar250 = pfVar38[iVar94 + -1 + iVar99];
          }
          if ((0 < iVar98) && (0 < iVar192)) {
            fVar249 = pfVar38[iVar192 + -1 + iVar99];
          }
          auVar215 = vxorps_avx512vl(auVar215,auVar215);
          auVar220._0_12_ = ZEXT812(0);
          auVar220._12_4_ = 0;
          iVar94 = iVar189 - iVar52;
          if (iVar166 < iVar189 - iVar52) {
            iVar94 = iVar166;
          }
          iVar192 = (iVar44 - iVar52) + iVar189;
          if (iVar166 <= iVar192) {
            iVar192 = iVar166;
          }
          if ((0 < iVar86) && (0 < iVar94)) {
            auVar220 = ZEXT416((uint)pfVar38[iVar210 + iVar94 + -1]);
          }
          if ((0 < iVar86) && (0 < iVar192)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar210 + iVar192 + -1]);
          }
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          auVar218 = vxorps_avx512vl(auVar218,auVar218);
          if ((0 < iVar98) && (0 < iVar94)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar99]);
          }
          if ((0 < iVar98) && (0 < iVar192)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar192 + -1 + iVar99]);
          }
          iVar94 = -iVar44 + 1 + iVar189;
          fVar248 = 0.0;
          if (iVar166 < iVar94) {
            iVar94 = iVar166;
          }
          auVar222 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar247) - fVar250) + fVar249)),
                                    auVar215);
          auVar220 = vsubss_avx512f(auVar220,auVar216);
          iVar193 = iVar94 + -1;
          auVar220 = vsubss_avx512f(auVar220,auVar218);
          iVar192 = iVar44 + iVar189;
          if (iVar166 <= iVar44 + iVar189) {
            iVar192 = iVar166;
          }
          auVar220 = vaddss_avx512f(auVar220,auVar217);
          auVar220 = vmaxss_avx(auVar220,ZEXT816(0) << 0x40);
          auVar220 = vfmadd132ss_fma(auVar220,auVar222,auVar237);
          fVar251 = 0.0;
          if ((0 < iVar64) && (0 < iVar94)) {
            fVar251 = pfVar38[iVar100 + iVar193];
          }
          iVar95 = iVar192 + -1;
          if ((0 < iVar64) && (0 < iVar192)) {
            fVar248 = pfVar38[iVar100 + iVar95];
          }
          fVar250 = 0.0;
          fVar247 = 0.0;
          if ((0 < iVar65) && (0 < iVar94)) {
            fVar247 = pfVar38[iVar101 + iVar193];
          }
          if ((0 < iVar65) && (0 < iVar192)) {
            fVar250 = pfVar38[iVar101 + iVar95];
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          if ((0 < iVar211) && (0 < iVar94)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar212 + iVar193]);
          }
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          if ((0 < iVar211) && (0 < iVar192)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar212 + iVar95]);
          }
          auVar218 = vxorps_avx512vl(auVar218,auVar218);
          auVar219 = vxorps_avx512vl(auVar219,auVar219);
          if ((0 < iVar66) && (0 < iVar94)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar193 + iVar102]);
          }
          if ((0 < iVar66) && (0 < iVar192)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar95 + iVar102]);
          }
          fVar249 = 0.0;
          iVar94 = iVar44 + 1 + iVar189;
          if (iVar166 <= iVar94) {
            iVar94 = iVar166;
          }
          auVar233 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar248) - fVar247) + fVar250)),
                                    auVar215);
          auVar222 = vsubss_avx512f(auVar216,auVar217);
          auVar222 = vsubss_avx512f(auVar222,auVar219);
          auVar222 = vaddss_avx512f(auVar222,auVar218);
          auVar222 = vmaxss_avx(auVar222,ZEXT816(0) << 0x40);
          auVar222 = vfmadd132ss_fma(auVar222,auVar233,auVar237);
          fVar251 = 0.0;
          if ((0 < iVar198) && (0 < iVar181)) {
            fVar251 = pfVar38[iVar103 + iVar147];
          }
          iVar192 = iVar94 + -1;
          if ((0 < iVar198) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar103 + iVar192];
          }
          fVar247 = 0.0;
          if (bVar190) {
            auVar215 = ZEXT416((uint)pfVar38[iVar157 + iVar147]);
          }
          if ((0 < iVar62) && (0 < iVar94)) {
            fVar247 = pfVar38[iVar157 + iVar192];
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          iVar193 = -iVar44 + iVar189;
          if (iVar166 < iVar193) {
            iVar193 = iVar166;
          }
          iVar95 = iVar193 + -1;
          if ((0 < iVar63) && (0 < iVar193)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar158 + iVar95]);
          }
          auVar218 = vxorps_avx512vl(auVar218,auVar218);
          if (bVar174) {
            auVar218 = ZEXT416((uint)pfVar38[iVar158 + iVar197]);
          }
          auVar219 = vxorps_avx512vl(auVar219,auVar219);
          auVar221 = vxorps_avx512vl(auVar221,auVar221);
          if ((0 < iVar160) && (0 < iVar193)) {
            auVar221 = ZEXT416((uint)pfVar38[iVar104 + iVar95]);
          }
          if ((0 < iVar160) && (0 < iVar204)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar104 + iVar197]);
          }
          auVar224 = vxorps_avx512vl(auVar224,auVar224);
          if ((0 < iVar198) && (0 < iVar193)) {
            auVar224 = ZEXT416((uint)pfVar38[iVar103 + iVar95]);
          }
          auVar225 = vxorps_avx512vl(auVar225,auVar225);
          if ((0 < iVar198) && (0 < iVar204)) {
            auVar225 = ZEXT416((uint)pfVar38[iVar103 + iVar197]);
          }
          auVar226 = vxorps_avx512vl(auVar226,auVar226);
          auVar227 = vxorps_avx512vl(auVar227,auVar227);
          if ((0 < iVar62) && (0 < iVar193)) {
            auVar227 = ZEXT416((uint)pfVar38[iVar95 + iVar157]);
          }
          if (bVar40 && bVar39) {
            auVar226 = ZEXT416((uint)pfVar38[iVar157 + iVar197]);
          }
          auVar229 = vxorps_avx512vl(auVar229,auVar229);
          if (bVar42 && bVar41) {
            auVar229 = ZEXT416((uint)pfVar38[iVar158 + iVar147]);
          }
          auVar230 = vxorps_avx512vl(auVar230,auVar230);
          if ((0 < iVar63) && (0 < iVar94)) {
            auVar230 = ZEXT416((uint)pfVar38[iVar158 + iVar192]);
          }
          auVar231 = vxorps_avx512vl(auVar231,auVar231);
          auVar232 = vxorps_avx512vl(auVar232,auVar232);
          if ((0 < iVar160) && (0 < iVar181)) {
            auVar232 = ZEXT416((uint)pfVar38[iVar104 + iVar147]);
          }
          if ((0 < iVar160) && (0 < iVar94)) {
            auVar231 = ZEXT416((uint)pfVar38[iVar192 + iVar104]);
          }
          auVar233 = vsubss_avx512f(auVar217,auVar218);
          auVar234 = vsubss_avx512f(ZEXT416((uint)(fVar251 - fVar249)),auVar215);
          auVar233 = vsubss_avx512f(auVar233,auVar221);
          auVar233 = vaddss_avx512f(auVar233,auVar219);
          auVar234 = vmaxss_avx512f(ZEXT416((uint)(auVar234._0_4_ + fVar247)),auVar216);
          auVar235 = vmaxss_avx512f(auVar233,auVar223);
          auVar233 = vsubss_avx512f(auVar224,auVar225);
          auVar233 = vsubss_avx512f(auVar233,auVar227);
          auVar233 = vaddss_avx512f(auVar233,auVar226);
          auVar236 = vmaxss_avx512f(auVar233,auVar228);
          auVar233 = vsubss_avx512f(auVar229,auVar230);
          auVar233 = vsubss_avx512f(auVar233,auVar232);
          auVar233 = vaddss_avx512f(auVar233,auVar231);
          fVar247 = 0.0;
          auVar233 = vmaxss_avx(auVar233,ZEXT816(0) << 0x20);
          fVar251 = ((auVar234._0_4_ + auVar235._0_4_) - auVar236._0_4_) - auVar233._0_4_;
          auVar233 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar251 * -0.81)),auVar220,auVar222);
          fVar251 = 0.0;
          pfVar24[lVar149 + lVar208] = auVar233._0_4_ * fVar239 * fVar239;
          pbVar25[lVar208 + lVar149] = 0.0 <= auVar220._0_4_ + auVar222._0_4_;
          iVar94 = iVar189 - iVar150;
          if (iVar166 < iVar189 - iVar150) {
            iVar94 = iVar166;
          }
          iVar192 = (iVar5 - iVar150) + iVar189;
          if (iVar166 <= iVar192) {
            iVar192 = iVar166;
          }
          if ((0 < iVar87) && (0 < iVar94)) {
            fVar251 = pfVar38[iVar199 + iVar94 + -1];
          }
          if ((0 < iVar87) && (0 < iVar192)) {
            fVar247 = pfVar38[iVar199 + iVar192 + -1];
          }
          fVar249 = 0.0;
          fVar250 = 0.0;
          if ((0 < iVar105) && (0 < iVar94)) {
            fVar250 = pfVar38[iVar94 + -1 + iVar106];
          }
          if ((0 < iVar105) && (0 < iVar192)) {
            fVar249 = pfVar38[iVar192 + -1 + iVar106];
          }
          auVar215 = vxorps_avx512vl(auVar215,auVar215);
          auVar222._0_12_ = ZEXT812(0);
          auVar222._12_4_ = 0;
          iVar94 = iVar189 - iVar53;
          if (iVar166 < iVar189 - iVar53) {
            iVar94 = iVar166;
          }
          iVar192 = (iVar45 - iVar53) + iVar189;
          if (iVar166 <= iVar192) {
            iVar192 = iVar166;
          }
          if ((0 < iVar87) && (0 < iVar94)) {
            auVar222 = ZEXT416((uint)pfVar38[iVar199 + iVar94 + -1]);
          }
          if ((0 < iVar87) && (0 < iVar192)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar199 + iVar192 + -1]);
          }
          auVar220 = vxorps_avx512vl(auVar217,auVar217);
          auVar217 = vxorps_avx512vl(auVar218,auVar218);
          if ((0 < iVar105) && (0 < iVar94)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar106]);
          }
          if ((0 < iVar105) && (0 < iVar192)) {
            auVar220 = ZEXT416((uint)pfVar38[iVar192 + -1 + iVar106]);
          }
          iVar94 = -iVar45 + 1 + iVar189;
          fVar248 = 0.0;
          if (iVar166 < iVar94) {
            iVar94 = iVar166;
          }
          auVar218 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar247) - fVar250) + fVar249)),
                                    auVar215);
          auVar222 = vsubss_avx512f(auVar222,auVar216);
          iVar193 = iVar94 + -1;
          auVar222 = vsubss_avx512f(auVar222,auVar217);
          iVar192 = iVar45 + iVar189;
          if (iVar166 <= iVar45 + iVar189) {
            iVar192 = iVar166;
          }
          auVar222 = vaddss_avx512f(auVar222,auVar220);
          auVar222 = vmaxss_avx(auVar222,ZEXT816(0) << 0x40);
          auVar218 = vfmadd132ss_fma(auVar222,auVar218,auVar237);
          fVar251 = 0.0;
          if ((0 < iVar67) && (0 < iVar94)) {
            fVar251 = pfVar38[iVar107 + iVar193];
          }
          iVar95 = iVar192 + -1;
          if ((0 < iVar67) && (0 < iVar192)) {
            fVar248 = pfVar38[iVar107 + iVar95];
          }
          fVar250 = 0.0;
          fVar247 = 0.0;
          if ((0 < iVar68) && (0 < iVar94)) {
            fVar247 = pfVar38[iVar108 + iVar193];
          }
          if ((0 < iVar68) && (0 < iVar192)) {
            fVar250 = pfVar38[iVar108 + iVar95];
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          if ((0 < iVar200) && (0 < iVar94)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar167 + iVar193]);
          }
          auVar220 = vxorps_avx512vl(auVar220,auVar220);
          if ((0 < iVar200) && (0 < iVar192)) {
            auVar220 = ZEXT416((uint)pfVar38[iVar167 + iVar95]);
          }
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          auVar219 = vxorps_avx512vl(auVar219,auVar219);
          if ((0 < iVar69) && (0 < iVar94)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar193 + iVar109]);
          }
          if ((0 < iVar69) && (0 < iVar192)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar95 + iVar109]);
          }
          fVar249 = 0.0;
          iVar94 = iVar45 + 1 + iVar189;
          if (iVar166 <= iVar94) {
            iVar94 = iVar166;
          }
          auVar233 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar248) - fVar247) + fVar250)),
                                    auVar215);
          auVar222 = vsubss_avx512f(auVar216,auVar220);
          auVar222 = vsubss_avx512f(auVar222,auVar219);
          auVar222 = vaddss_avx512f(auVar222,auVar217);
          auVar222 = vmaxss_avx(auVar222,ZEXT816(0) << 0x40);
          auVar222 = vfmadd132ss_fma(auVar222,auVar233,auVar237);
          fVar251 = 0.0;
          if ((0 < iVar213) && (0 < iVar181)) {
            fVar251 = pfVar38[iVar110 + iVar147];
          }
          iVar192 = iVar94 + -1;
          if ((0 < iVar213) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar110 + iVar192];
          }
          fVar247 = 0.0;
          if (bVar190) {
            auVar215 = ZEXT416((uint)pfVar38[iVar157 + iVar147]);
          }
          if ((0 < iVar62) && (0 < iVar94)) {
            fVar247 = pfVar38[iVar157 + iVar192];
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          auVar220 = vxorps_avx512vl(auVar220,auVar220);
          iVar193 = -iVar45 + iVar189;
          if (iVar166 < iVar193) {
            iVar193 = iVar166;
          }
          iVar95 = iVar193 + -1;
          if ((0 < iVar63) && (0 < iVar193)) {
            auVar220 = ZEXT416((uint)pfVar38[iVar158 + iVar95]);
          }
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          if (bVar174) {
            auVar217 = ZEXT416((uint)pfVar38[iVar158 + iVar197]);
          }
          auVar219 = vxorps_avx512vl(auVar219,auVar219);
          auVar221 = vxorps_avx512vl(auVar221,auVar221);
          if ((0 < iVar161) && (0 < iVar193)) {
            auVar221 = ZEXT416((uint)pfVar38[iVar111 + iVar95]);
          }
          if ((0 < iVar161) && (0 < iVar204)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar111 + iVar197]);
          }
          auVar224 = vxorps_avx512vl(auVar224,auVar224);
          if ((0 < iVar213) && (0 < iVar193)) {
            auVar224 = ZEXT416((uint)pfVar38[iVar110 + iVar95]);
          }
          auVar225 = vxorps_avx512vl(auVar225,auVar225);
          if ((0 < iVar213) && (0 < iVar204)) {
            auVar225 = ZEXT416((uint)pfVar38[iVar110 + iVar197]);
          }
          auVar226 = vxorps_avx512vl(auVar226,auVar226);
          auVar227 = vxorps_avx512vl(auVar227,auVar227);
          if ((0 < iVar62) && (0 < iVar193)) {
            auVar227 = ZEXT416((uint)pfVar38[iVar95 + iVar157]);
          }
          if (bVar40 && bVar39) {
            auVar226 = ZEXT416((uint)pfVar38[iVar157 + iVar197]);
          }
          auVar229 = vxorps_avx512vl(auVar229,auVar229);
          if (bVar42 && bVar41) {
            auVar229 = ZEXT416((uint)pfVar38[iVar158 + iVar147]);
          }
          auVar230 = vxorps_avx512vl(auVar230,auVar230);
          if ((0 < iVar63) && (0 < iVar94)) {
            auVar230 = ZEXT416((uint)pfVar38[iVar158 + iVar192]);
          }
          auVar231 = vxorps_avx512vl(auVar231,auVar231);
          auVar232 = vxorps_avx512vl(auVar232,auVar232);
          if ((0 < iVar161) && (0 < iVar181)) {
            auVar232 = ZEXT416((uint)pfVar38[iVar111 + iVar147]);
          }
          if ((0 < iVar161) && (0 < iVar94)) {
            auVar231 = ZEXT416((uint)pfVar38[iVar192 + iVar111]);
          }
          auVar233 = vsubss_avx512f(auVar220,auVar217);
          auVar234 = vsubss_avx512f(ZEXT416((uint)(fVar251 - fVar249)),auVar215);
          auVar233 = vsubss_avx512f(auVar233,auVar221);
          auVar233 = vaddss_avx512f(auVar233,auVar219);
          auVar234 = vmaxss_avx512f(ZEXT416((uint)(auVar234._0_4_ + fVar247)),auVar216);
          auVar235 = vmaxss_avx512f(auVar233,auVar223);
          auVar233 = vsubss_avx512f(auVar224,auVar225);
          auVar233 = vsubss_avx512f(auVar233,auVar227);
          auVar233 = vaddss_avx512f(auVar233,auVar226);
          auVar236 = vmaxss_avx512f(auVar233,auVar228);
          auVar233 = vsubss_avx512f(auVar229,auVar230);
          auVar233 = vsubss_avx512f(auVar233,auVar232);
          auVar233 = vaddss_avx512f(auVar233,auVar231);
          fVar247 = 0.0;
          auVar233 = vmaxss_avx(auVar233,ZEXT816(0) << 0x20);
          fVar251 = ((auVar234._0_4_ + auVar235._0_4_) - auVar236._0_4_) - auVar233._0_4_;
          auVar233 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar251 * -0.81)),auVar218,auVar222);
          fVar251 = 0.0;
          pfVar26[lVar149 + lVar208] = auVar233._0_4_ * fVar240 * fVar240;
          pbVar27[lVar208 + lVar149] = 0.0 <= auVar218._0_4_ + auVar222._0_4_;
          iVar94 = iVar189 - iVar177;
          if (iVar166 < iVar189 - iVar177) {
            iVar94 = iVar166;
          }
          iVar192 = (iVar4 - iVar177) + iVar189;
          if (iVar166 <= iVar192) {
            iVar192 = iVar166;
          }
          if ((0 < iVar88) && (0 < iVar94)) {
            fVar251 = pfVar38[iVar201 + iVar94 + -1];
          }
          if ((0 < iVar88) && (0 < iVar192)) {
            fVar247 = pfVar38[iVar201 + iVar192 + -1];
          }
          fVar249 = 0.0;
          fVar250 = 0.0;
          if ((0 < iVar112) && (0 < iVar94)) {
            fVar250 = pfVar38[iVar94 + -1 + iVar113];
          }
          if ((0 < iVar112) && (0 < iVar192)) {
            fVar249 = pfVar38[iVar192 + -1 + iVar113];
          }
          auVar215 = vxorps_avx512vl(auVar215,auVar215);
          in_ZMM16 = ZEXT1664(auVar215);
          auVar218._0_12_ = ZEXT812(0);
          auVar218._12_4_ = 0;
          iVar94 = iVar189 - iVar54;
          if (iVar166 < iVar189 - iVar54) {
            iVar94 = iVar166;
          }
          iVar192 = (iVar46 - iVar54) + iVar189;
          if (iVar166 <= iVar192) {
            iVar192 = iVar166;
          }
          if ((0 < iVar88) && (0 < iVar94)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar201 + iVar94 + -1]);
          }
          if ((0 < iVar88) && (0 < iVar192)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar201 + iVar192 + -1]);
          }
          auVar220 = vxorps_avx512vl(auVar220,auVar220);
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          if ((0 < iVar112) && (0 < iVar94)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar113]);
          }
          if ((0 < iVar112) && (0 < iVar192)) {
            auVar220 = ZEXT416((uint)pfVar38[iVar192 + -1 + iVar113]);
          }
          iVar94 = -iVar46 + 1 + iVar189;
          fVar248 = 0.0;
          if (iVar166 < iVar94) {
            iVar94 = iVar166;
          }
          auVar222 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar247) - fVar250) + fVar249)),
                                    auVar215);
          auVar218 = vsubss_avx512f(auVar218,auVar216);
          iVar193 = iVar94 + -1;
          auVar218 = vsubss_avx512f(auVar218,auVar217);
          iVar192 = iVar46 + iVar189;
          if (iVar166 <= iVar46 + iVar189) {
            iVar192 = iVar166;
          }
          auVar218 = vaddss_avx512f(auVar218,auVar220);
          auVar218 = vmaxss_avx(auVar218,ZEXT816(0) << 0x40);
          auVar218 = vfmadd132ss_fma(auVar218,auVar222,auVar237);
          fVar251 = 0.0;
          if ((0 < iVar70) && (0 < iVar94)) {
            fVar251 = pfVar38[iVar114 + iVar193];
          }
          iVar95 = iVar192 + -1;
          if ((0 < iVar70) && (0 < iVar192)) {
            fVar248 = pfVar38[iVar114 + iVar95];
          }
          fVar250 = 0.0;
          fVar247 = 0.0;
          if ((0 < iVar71) && (0 < iVar94)) {
            fVar247 = pfVar38[iVar115 + iVar193];
          }
          if ((0 < iVar71) && (0 < iVar192)) {
            fVar250 = pfVar38[iVar115 + iVar95];
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          if ((0 < iVar168) && (0 < iVar94)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar169 + iVar193]);
          }
          auVar220 = vxorps_avx512vl(auVar220,auVar220);
          if ((0 < iVar168) && (0 < iVar192)) {
            auVar220 = ZEXT416((uint)pfVar38[iVar169 + iVar95]);
          }
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          auVar219 = vxorps_avx512vl(auVar219,auVar219);
          if ((0 < iVar72) && (0 < iVar94)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar193 + iVar116]);
          }
          if ((0 < iVar72) && (0 < iVar192)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar95 + iVar116]);
          }
          fVar249 = 0.0;
          iVar94 = iVar46 + 1 + iVar189;
          if (iVar166 <= iVar94) {
            iVar94 = iVar166;
          }
          auVar222 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar248) - fVar247) + fVar250)),
                                    auVar215);
          auVar215 = vsubss_avx512f(auVar216,auVar220);
          auVar215 = vsubss_avx512f(auVar215,auVar219);
          auVar215 = vaddss_avx512f(auVar215,auVar217);
          auVar215 = vmaxss_avx(auVar215,ZEXT816(0) << 0x40);
          auVar215 = vfmadd132ss_fma(auVar215,auVar222,auVar237);
          fVar251 = 0.0;
          if ((0 < iVar214) && (0 < iVar181)) {
            fVar251 = pfVar38[iVar117 + iVar147];
          }
          iVar192 = iVar94 + -1;
          if ((0 < iVar214) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar117 + iVar192];
          }
          fVar247 = 0.0;
          if (bVar190) {
            in_ZMM16 = ZEXT464((uint)pfVar38[iVar157 + iVar147]);
          }
          if ((0 < iVar62) && (0 < iVar94)) {
            fVar247 = pfVar38[iVar157 + iVar192];
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          auVar220 = vxorps_avx512vl(auVar220,auVar220);
          in_ZMM18 = ZEXT1664(auVar220);
          iVar193 = -iVar46 + iVar189;
          if (iVar166 < iVar193) {
            iVar193 = iVar166;
          }
          iVar95 = iVar193 + -1;
          if ((0 < iVar63) && (0 < iVar193)) {
            in_ZMM18 = ZEXT464((uint)pfVar38[iVar158 + iVar95]);
          }
          auVar220 = vxorps_avx512vl(auVar217,auVar217);
          in_ZMM19 = ZEXT1664(auVar220);
          if (bVar174) {
            in_ZMM19 = ZEXT464((uint)pfVar38[iVar158 + iVar197]);
          }
          auVar220 = vxorps_avx512vl(auVar219,auVar219);
          in_ZMM20 = ZEXT1664(auVar220);
          auVar220 = vxorps_avx512vl(auVar221,auVar221);
          in_ZMM21 = ZEXT1664(auVar220);
          if ((0 < iVar162) && (0 < iVar193)) {
            in_ZMM21 = ZEXT464((uint)pfVar38[iVar118 + iVar95]);
          }
          if ((0 < iVar162) && (0 < iVar204)) {
            in_ZMM20 = ZEXT464((uint)pfVar38[iVar118 + iVar197]);
          }
          auVar220 = vxorps_avx512vl(auVar224,auVar224);
          in_ZMM23 = ZEXT1664(auVar220);
          if ((0 < iVar214) && (0 < iVar193)) {
            in_ZMM23 = ZEXT464((uint)pfVar38[iVar117 + iVar95]);
          }
          auVar220 = vxorps_avx512vl(auVar225,auVar225);
          in_ZMM24 = ZEXT1664(auVar220);
          if ((0 < iVar214) && (0 < iVar204)) {
            in_ZMM24 = ZEXT464((uint)pfVar38[iVar117 + iVar197]);
          }
          auVar220 = vxorps_avx512vl(auVar226,auVar226);
          in_ZMM25 = ZEXT1664(auVar220);
          auVar220 = vxorps_avx512vl(auVar227,auVar227);
          in_ZMM26 = ZEXT1664(auVar220);
          if ((0 < iVar62) && (0 < iVar193)) {
            in_ZMM26 = ZEXT464((uint)pfVar38[iVar95 + iVar157]);
          }
          if (bVar40 && bVar39) {
            in_ZMM25 = ZEXT464((uint)pfVar38[iVar157 + iVar197]);
          }
          auVar220 = vxorps_avx512vl(auVar229,auVar229);
          in_ZMM28 = ZEXT1664(auVar220);
          if (bVar42 && bVar41) {
            in_ZMM28 = ZEXT464((uint)pfVar38[iVar158 + iVar147]);
          }
          auVar220 = vxorps_avx512vl(auVar230,auVar230);
          in_ZMM29 = ZEXT1664(auVar220);
          if ((0 < iVar63) && (0 < iVar94)) {
            in_ZMM29 = ZEXT464((uint)pfVar38[iVar158 + iVar192]);
          }
          auVar220 = vxorps_avx512vl(auVar231,auVar231);
          in_ZMM30 = ZEXT1664(auVar220);
          auVar220 = vxorps_avx512vl(auVar232,auVar232);
          in_ZMM31 = ZEXT1664(auVar220);
          if ((0 < iVar162) && (0 < iVar181)) {
            in_ZMM31 = ZEXT464((uint)pfVar38[iVar118 + iVar147]);
          }
          if ((0 < iVar162) && (0 < iVar94)) {
            in_ZMM30 = ZEXT464((uint)pfVar38[iVar192 + iVar118]);
          }
          auVar224 = in_ZMM18._0_16_;
          auVar225 = in_ZMM19._0_16_;
          auVar220 = vsubss_avx512f(auVar224,auVar225);
          auVar221 = in_ZMM16._0_16_;
          auVar217 = vsubss_avx512f(ZEXT416((uint)(fVar251 - fVar249)),auVar221);
          auVar227 = in_ZMM21._0_16_;
          auVar220 = vsubss_avx512f(auVar220,auVar227);
          auVar226 = in_ZMM20._0_16_;
          auVar220 = vaddss_avx512f(auVar220,auVar226);
          auVar217 = vmaxss_avx512f(ZEXT416((uint)(auVar217._0_4_ + fVar247)),auVar216);
          auVar219 = vmaxss_avx512f(auVar220,auVar223);
          auVar229 = in_ZMM23._0_16_;
          auVar230 = in_ZMM24._0_16_;
          auVar220 = vsubss_avx512f(auVar229,auVar230);
          auVar232 = in_ZMM26._0_16_;
          auVar220 = vsubss_avx512f(auVar220,auVar232);
          auVar231 = in_ZMM25._0_16_;
          auVar220 = vaddss_avx512f(auVar220,auVar231);
          auVar222 = vmaxss_avx512f(auVar220,auVar228);
          auVar233 = in_ZMM28._0_16_;
          auVar234 = in_ZMM29._0_16_;
          auVar220 = vsubss_avx512f(auVar233,auVar234);
          auVar236 = in_ZMM31._0_16_;
          auVar220 = vsubss_avx512f(auVar220,auVar236);
          auVar235 = in_ZMM30._0_16_;
          auVar220 = vaddss_avx512f(auVar220,auVar235);
          auVar220 = vmaxss_avx(auVar220,auVar246);
          fVar251 = ((auVar217._0_4_ + auVar219._0_4_) - auVar222._0_4_) - auVar220._0_4_;
          auVar220 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar251 * -0.81)),auVar218,auVar215);
          pfVar28[lVar149 + lVar208] = auVar220._0_4_ * fVar241 * fVar241;
          pbVar29[lVar208 + lVar149] = 0.0 <= auVar218._0_4_ + auVar215._0_4_;
          uVar148 = (uint)lVar208 | local_734;
          if ((uVar148 & 1) == 0) {
            fVar247 = 0.0;
            fVar251 = 0.0;
            iVar94 = iVar189 - iVar183;
            if (iVar166 < iVar189 - iVar183) {
              iVar94 = iVar166;
            }
            iVar192 = (iVar6 - iVar183) + iVar189;
            if (iVar166 <= iVar192) {
              iVar192 = iVar166;
            }
            if ((0 < iVar89) && (0 < iVar94)) {
              fVar251 = pfVar38[iVar202 + iVar94 + -1];
            }
            if ((0 < iVar89) && (0 < iVar192)) {
              fVar247 = pfVar38[iVar202 + iVar192 + -1];
            }
            fVar249 = 0.0;
            fVar250 = 0.0;
            if ((0 < iVar119) && (0 < iVar94)) {
              fVar250 = pfVar38[iVar94 + -1 + iVar120];
            }
            if ((0 < iVar119) && (0 < iVar192)) {
              fVar249 = pfVar38[iVar192 + -1 + iVar120];
            }
            auVar215 = vxorps_avx512vl(auVar221,auVar221);
            auVar220 = ZEXT816(0) << 0x40;
            iVar94 = iVar189 - iVar55;
            if (iVar166 < iVar189 - iVar55) {
              iVar94 = iVar166;
            }
            iVar192 = (iVar47 - iVar55) + iVar189;
            if (iVar166 <= iVar192) {
              iVar192 = iVar166;
            }
            if ((0 < iVar89) && (0 < iVar94)) {
              auVar220 = ZEXT416((uint)pfVar38[iVar202 + iVar94 + -1]);
            }
            if ((0 < iVar89) && (0 < iVar192)) {
              auVar216 = ZEXT416((uint)pfVar38[iVar202 + iVar192 + -1]);
            }
            auVar217 = vxorps_avx512vl(auVar224,auVar224);
            auVar218 = vxorps_avx512vl(auVar225,auVar225);
            if ((0 < iVar119) && (0 < iVar94)) {
              auVar218 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar120]);
            }
            if ((0 < iVar119) && (0 < iVar192)) {
              auVar217 = ZEXT416((uint)pfVar38[iVar192 + -1 + iVar120]);
            }
            fVar248 = 0.0;
            iVar94 = -iVar47 + 1 + iVar189;
            if (iVar166 < iVar94) {
              iVar94 = iVar166;
            }
            auVar219 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar247) - fVar250) + fVar249)),
                                      auVar215);
            auVar220 = vsubss_avx512f(auVar220,auVar216);
            iVar192 = iVar47 + iVar189;
            if (iVar166 <= iVar47 + iVar189) {
              iVar192 = iVar166;
            }
            iVar193 = iVar94 + -1;
            auVar220 = vsubss_avx512f(auVar220,auVar218);
            auVar220 = vaddss_avx512f(auVar220,auVar217);
            auVar220 = vmaxss_avx(auVar220,ZEXT816(0) << 0x40);
            auVar220 = vfmadd132ss_fma(auVar220,auVar219,auVar237);
            fVar251 = 0.0;
            if ((0 < iVar73) && (0 < iVar94)) {
              fVar251 = pfVar38[iVar121 + iVar193];
            }
            iVar95 = iVar192 + -1;
            if ((0 < iVar73) && (0 < iVar192)) {
              fVar248 = pfVar38[iVar121 + iVar95];
            }
            fVar250 = 0.0;
            fVar247 = 0.0;
            if ((0 < iVar74) && (0 < iVar94)) {
              fVar247 = pfVar38[iVar122 + iVar193];
            }
            if ((0 < iVar74) && (0 < iVar192)) {
              fVar250 = pfVar38[iVar122 + iVar95];
            }
            auVar216 = vxorps_avx512vl(auVar216,auVar216);
            if ((0 < iVar180) && (0 < iVar94)) {
              auVar216 = ZEXT416((uint)pfVar38[iVar207 + iVar193]);
            }
            auVar217 = vxorps_avx512vl(auVar217,auVar217);
            if ((0 < iVar180) && (0 < iVar192)) {
              auVar217 = ZEXT416((uint)pfVar38[iVar207 + iVar95]);
            }
            auVar218 = vxorps_avx512vl(auVar218,auVar218);
            auVar219 = vxorps_avx512vl(auVar226,auVar226);
            if ((0 < iVar75) && (0 < iVar94)) {
              auVar219 = ZEXT416((uint)pfVar38[iVar193 + iVar123]);
            }
            if ((0 < iVar75) && (0 < iVar192)) {
              auVar218 = ZEXT416((uint)pfVar38[iVar95 + iVar123]);
            }
            fVar249 = 0.0;
            iVar94 = iVar47 + 1 + iVar189;
            if (iVar166 <= iVar94) {
              iVar94 = iVar166;
            }
            auVar221 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar248) - fVar247) + fVar250)),
                                      auVar215);
            auVar222 = vsubss_avx512f(auVar216,auVar217);
            auVar222 = vsubss_avx512f(auVar222,auVar219);
            auVar222 = vaddss_avx512f(auVar222,auVar218);
            auVar222 = vmaxss_avx(auVar222,ZEXT816(0) << 0x40);
            auVar222 = vfmadd132ss_fma(auVar222,auVar221,auVar237);
            fVar251 = 0.0;
            if ((0 < iVar170) && (0 < iVar181)) {
              fVar251 = pfVar38[iVar124 + iVar147];
            }
            iVar192 = iVar94 + -1;
            if ((0 < iVar170) && (0 < iVar94)) {
              fVar249 = pfVar38[iVar124 + iVar192];
            }
            fVar247 = 0.0;
            if (bVar190) {
              auVar215 = ZEXT416((uint)pfVar38[iVar157 + iVar147]);
            }
            if ((0 < iVar62) && (0 < iVar94)) {
              fVar247 = pfVar38[iVar157 + iVar192];
            }
            auVar216 = vxorps_avx512vl(auVar216,auVar216);
            auVar217 = vxorps_avx512vl(auVar217,auVar217);
            iVar193 = -iVar47 + iVar189;
            if (iVar166 < iVar193) {
              iVar193 = iVar166;
            }
            iVar95 = iVar193 + -1;
            if ((0 < iVar63) && (0 < iVar193)) {
              auVar217 = ZEXT416((uint)pfVar38[iVar158 + iVar95]);
            }
            auVar218 = vxorps_avx512vl(auVar218,auVar218);
            if (bVar174) {
              auVar218 = ZEXT416((uint)pfVar38[iVar158 + iVar197]);
            }
            auVar219 = vxorps_avx512vl(auVar219,auVar219);
            auVar221 = vxorps_avx512vl(auVar227,auVar227);
            if ((0 < iVar163) && (0 < iVar193)) {
              auVar221 = ZEXT416((uint)pfVar38[iVar125 + iVar95]);
            }
            if ((0 < iVar163) && (0 < iVar204)) {
              auVar219 = ZEXT416((uint)pfVar38[iVar125 + iVar197]);
            }
            auVar224 = vxorps_avx512vl(auVar229,auVar229);
            if ((0 < iVar170) && (0 < iVar193)) {
              auVar224 = ZEXT416((uint)pfVar38[iVar124 + iVar95]);
            }
            auVar225 = vxorps_avx512vl(auVar230,auVar230);
            if ((0 < iVar170) && (0 < iVar204)) {
              auVar225 = ZEXT416((uint)pfVar38[iVar124 + iVar197]);
            }
            auVar226 = vxorps_avx512vl(auVar231,auVar231);
            auVar227 = vxorps_avx512vl(auVar232,auVar232);
            if ((0 < iVar62) && (0 < iVar193)) {
              auVar227 = ZEXT416((uint)pfVar38[iVar95 + iVar157]);
            }
            if (bVar40 && bVar39) {
              auVar226 = ZEXT416((uint)pfVar38[iVar157 + iVar197]);
            }
            auVar229 = vxorps_avx512vl(auVar233,auVar233);
            if (bVar42 && bVar41) {
              auVar229 = ZEXT416((uint)pfVar38[iVar158 + iVar147]);
            }
            auVar230 = vxorps_avx512vl(auVar234,auVar234);
            if ((0 < iVar63) && (0 < iVar94)) {
              auVar230 = ZEXT416((uint)pfVar38[iVar158 + iVar192]);
            }
            auVar231 = vxorps_avx512vl(auVar235,auVar235);
            auVar232 = vxorps_avx512vl(auVar236,auVar236);
            if ((0 < iVar163) && (0 < iVar181)) {
              auVar232 = ZEXT416((uint)pfVar38[iVar125 + iVar147]);
            }
            if ((0 < iVar163) && (0 < iVar94)) {
              auVar231 = ZEXT416((uint)pfVar38[iVar192 + iVar125]);
            }
            auVar233 = vsubss_avx512f(auVar217,auVar218);
            auVar234 = vsubss_avx512f(ZEXT416((uint)(fVar251 - fVar249)),auVar215);
            auVar233 = vsubss_avx512f(auVar233,auVar221);
            auVar233 = vaddss_avx512f(auVar233,auVar219);
            auVar234 = vmaxss_avx512f(ZEXT416((uint)(auVar234._0_4_ + fVar247)),auVar216);
            auVar235 = vmaxss_avx512f(auVar233,auVar223);
            auVar233 = vsubss_avx512f(auVar224,auVar225);
            auVar233 = vsubss_avx512f(auVar233,auVar227);
            auVar233 = vaddss_avx512f(auVar233,auVar226);
            auVar236 = vmaxss_avx512f(auVar233,auVar228);
            auVar233 = vsubss_avx512f(auVar229,auVar230);
            auVar233 = vsubss_avx512f(auVar233,auVar232);
            auVar233 = vaddss_avx512f(auVar233,auVar231);
            fVar247 = 0.0;
            auVar233 = vmaxss_avx(auVar233,ZEXT816(0) << 0x20);
            fVar251 = ((auVar234._0_4_ + auVar235._0_4_) - auVar236._0_4_) - auVar233._0_4_;
            auVar233 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar251 * -0.81)),auVar220,auVar222)
            ;
            fVar251 = 0.0;
            pfVar30[iVar182] = auVar233._0_4_ * fVar242 * fVar242;
            pbVar31[iVar182] = 0.0 <= auVar220._0_4_ + auVar222._0_4_;
            iVar94 = iVar189 - iVar191;
            if (iVar166 < iVar189 - iVar191) {
              iVar94 = iVar166;
            }
            iVar192 = (iVar7 - iVar191) + iVar189;
            if (iVar166 <= iVar192) {
              iVar192 = iVar166;
            }
            if ((0 < iVar90) && (0 < iVar94)) {
              fVar251 = pfVar38[iVar203 + iVar94 + -1];
            }
            if ((0 < iVar90) && (0 < iVar192)) {
              fVar247 = pfVar38[iVar203 + iVar192 + -1];
            }
            fVar249 = 0.0;
            fVar250 = 0.0;
            if ((0 < iVar126) && (0 < iVar94)) {
              fVar250 = pfVar38[iVar94 + -1 + iVar127];
            }
            if ((0 < iVar126) && (0 < iVar192)) {
              fVar249 = pfVar38[iVar192 + -1 + iVar127];
            }
            auVar215 = vxorps_avx512vl(auVar215,auVar215);
            in_ZMM16 = ZEXT1664(auVar215);
            auVar233._0_12_ = ZEXT812(0);
            auVar233._12_4_ = 0;
            iVar94 = iVar189 - iVar56;
            if (iVar166 < iVar189 - iVar56) {
              iVar94 = iVar166;
            }
            iVar192 = (iVar48 - iVar56) + iVar189;
            if (iVar166 <= iVar192) {
              iVar192 = iVar166;
            }
            if ((0 < iVar90) && (0 < iVar94)) {
              auVar233 = ZEXT416((uint)pfVar38[iVar203 + iVar94 + -1]);
            }
            if ((0 < iVar90) && (0 < iVar192)) {
              auVar216 = ZEXT416((uint)pfVar38[iVar203 + iVar192 + -1]);
            }
            auVar220 = vxorps_avx512vl(auVar217,auVar217);
            auVar217 = vxorps_avx512vl(auVar218,auVar218);
            if ((0 < iVar126) && (0 < iVar94)) {
              auVar217 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar127]);
            }
            if ((0 < iVar126) && (0 < iVar192)) {
              auVar220 = ZEXT416((uint)pfVar38[iVar192 + -1 + iVar127]);
            }
            iVar94 = -iVar48 + 1 + iVar189;
            fVar248 = 0.0;
            if (iVar166 < iVar94) {
              iVar94 = iVar166;
            }
            auVar218 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar247) - fVar250) + fVar249)),
                                      auVar215);
            auVar222 = vsubss_avx512f(auVar233,auVar216);
            iVar192 = iVar48 + iVar189;
            if (iVar166 <= iVar48 + iVar189) {
              iVar192 = iVar166;
            }
            iVar193 = iVar94 + -1;
            auVar222 = vsubss_avx512f(auVar222,auVar217);
            auVar222 = vaddss_avx512f(auVar222,auVar220);
            auVar222 = vmaxss_avx(auVar222,ZEXT816(0) << 0x40);
            auVar218 = vfmadd132ss_fma(auVar222,auVar218,auVar237);
            fVar251 = 0.0;
            if ((0 < iVar76) && (0 < iVar94)) {
              fVar251 = pfVar38[iVar128 + iVar193];
            }
            iVar95 = iVar192 + -1;
            if ((0 < iVar76) && (0 < iVar192)) {
              fVar248 = pfVar38[iVar128 + iVar95];
            }
            fVar250 = 0.0;
            fVar247 = 0.0;
            if ((0 < iVar77) && (0 < iVar94)) {
              fVar247 = pfVar38[iVar129 + iVar193];
            }
            if ((0 < iVar77) && (0 < iVar192)) {
              fVar250 = pfVar38[iVar129 + iVar95];
            }
            auVar216 = vxorps_avx512vl(auVar216,auVar216);
            if ((0 < iVar209) && (0 < iVar94)) {
              auVar216 = ZEXT416((uint)pfVar38[iVar195 + iVar193]);
            }
            auVar220 = vxorps_avx512vl(auVar220,auVar220);
            if ((0 < iVar209) && (0 < iVar192)) {
              auVar220 = ZEXT416((uint)pfVar38[iVar195 + iVar95]);
            }
            auVar217 = vxorps_avx512vl(auVar217,auVar217);
            auVar219 = vxorps_avx512vl(auVar219,auVar219);
            if ((0 < iVar78) && (0 < iVar94)) {
              auVar219 = ZEXT416((uint)pfVar38[iVar193 + iVar130]);
            }
            if ((0 < iVar78) && (0 < iVar192)) {
              auVar217 = ZEXT416((uint)pfVar38[iVar95 + iVar130]);
            }
            fVar249 = 0.0;
            iVar94 = iVar48 + 1 + iVar189;
            if (iVar166 <= iVar94) {
              iVar94 = iVar166;
            }
            auVar222 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar248) - fVar247) + fVar250)),
                                      auVar215);
            auVar215 = vsubss_avx512f(auVar216,auVar220);
            auVar215 = vsubss_avx512f(auVar215,auVar219);
            auVar215 = vaddss_avx512f(auVar215,auVar217);
            auVar215 = vmaxss_avx(auVar215,ZEXT816(0) << 0x40);
            auVar215 = vfmadd132ss_fma(auVar215,auVar222,auVar237);
            fVar251 = 0.0;
            if ((0 < iVar171) && (0 < iVar181)) {
              fVar251 = pfVar38[iVar131 + iVar147];
            }
            iVar192 = iVar94 + -1;
            if ((0 < iVar171) && (0 < iVar94)) {
              fVar249 = pfVar38[iVar131 + iVar192];
            }
            fVar247 = 0.0;
            if (bVar190) {
              in_ZMM16 = ZEXT464((uint)pfVar38[iVar157 + iVar147]);
            }
            if ((0 < iVar62) && (0 < iVar94)) {
              fVar247 = pfVar38[iVar157 + iVar192];
            }
            auVar216 = vxorps_avx512vl(auVar216,auVar216);
            auVar220 = vxorps_avx512vl(auVar220,auVar220);
            in_ZMM18 = ZEXT1664(auVar220);
            iVar193 = -iVar48 + iVar189;
            if (iVar166 < iVar193) {
              iVar193 = iVar166;
            }
            iVar95 = iVar193 + -1;
            if ((0 < iVar63) && (0 < iVar193)) {
              in_ZMM18 = ZEXT464((uint)pfVar38[iVar158 + iVar95]);
            }
            auVar220 = vxorps_avx512vl(auVar217,auVar217);
            in_ZMM19 = ZEXT1664(auVar220);
            if (bVar174) {
              in_ZMM19 = ZEXT464((uint)pfVar38[iVar158 + iVar197]);
            }
            auVar220 = vxorps_avx512vl(auVar219,auVar219);
            in_ZMM20 = ZEXT1664(auVar220);
            auVar220 = vxorps_avx512vl(auVar221,auVar221);
            in_ZMM21 = ZEXT1664(auVar220);
            if ((0 < iVar164) && (0 < iVar193)) {
              in_ZMM21 = ZEXT464((uint)pfVar38[iVar132 + iVar95]);
            }
            if ((0 < iVar164) && (0 < iVar204)) {
              in_ZMM20 = ZEXT464((uint)pfVar38[iVar132 + iVar197]);
            }
            auVar220 = vxorps_avx512vl(auVar224,auVar224);
            in_ZMM23 = ZEXT1664(auVar220);
            if ((0 < iVar171) && (0 < iVar193)) {
              in_ZMM23 = ZEXT464((uint)pfVar38[iVar131 + iVar95]);
            }
            auVar220 = vxorps_avx512vl(auVar225,auVar225);
            in_ZMM24 = ZEXT1664(auVar220);
            if ((0 < iVar171) && (0 < iVar204)) {
              in_ZMM24 = ZEXT464((uint)pfVar38[iVar131 + iVar197]);
            }
            auVar220 = vxorps_avx512vl(auVar226,auVar226);
            in_ZMM25 = ZEXT1664(auVar220);
            auVar220 = vxorps_avx512vl(auVar227,auVar227);
            in_ZMM26 = ZEXT1664(auVar220);
            if ((0 < iVar62) && (0 < iVar193)) {
              in_ZMM26 = ZEXT464((uint)pfVar38[iVar95 + iVar157]);
            }
            if (bVar40 && bVar39) {
              in_ZMM25 = ZEXT464((uint)pfVar38[iVar157 + iVar197]);
            }
            auVar220 = vxorps_avx512vl(auVar229,auVar229);
            in_ZMM28 = ZEXT1664(auVar220);
            if (bVar42 && bVar41) {
              in_ZMM28 = ZEXT464((uint)pfVar38[iVar158 + iVar147]);
            }
            auVar220 = vxorps_avx512vl(auVar230,auVar230);
            in_ZMM29 = ZEXT1664(auVar220);
            if ((0 < iVar63) && (0 < iVar94)) {
              in_ZMM29 = ZEXT464((uint)pfVar38[iVar158 + iVar192]);
            }
            auVar220 = vxorps_avx512vl(auVar231,auVar231);
            in_ZMM30 = ZEXT1664(auVar220);
            auVar220 = vxorps_avx512vl(auVar232,auVar232);
            in_ZMM31 = ZEXT1664(auVar220);
            if ((0 < iVar164) && (0 < iVar181)) {
              in_ZMM31 = ZEXT464((uint)pfVar38[iVar132 + iVar147]);
            }
            if ((0 < iVar164) && (0 < iVar94)) {
              in_ZMM30 = ZEXT464((uint)pfVar38[iVar192 + iVar132]);
            }
            auVar224 = in_ZMM18._0_16_;
            auVar225 = in_ZMM19._0_16_;
            auVar220 = vsubss_avx512f(auVar224,auVar225);
            auVar221 = in_ZMM16._0_16_;
            auVar217 = vsubss_avx512f(ZEXT416((uint)(fVar251 - fVar249)),auVar221);
            auVar227 = in_ZMM21._0_16_;
            auVar220 = vsubss_avx512f(auVar220,auVar227);
            auVar226 = in_ZMM20._0_16_;
            auVar220 = vaddss_avx512f(auVar220,auVar226);
            auVar217 = vmaxss_avx512f(ZEXT416((uint)(auVar217._0_4_ + fVar247)),auVar216);
            auVar219 = vmaxss_avx512f(auVar220,auVar223);
            auVar229 = in_ZMM23._0_16_;
            auVar230 = in_ZMM24._0_16_;
            auVar220 = vsubss_avx512f(auVar229,auVar230);
            auVar232 = in_ZMM26._0_16_;
            auVar220 = vsubss_avx512f(auVar220,auVar232);
            auVar231 = in_ZMM25._0_16_;
            auVar220 = vaddss_avx512f(auVar220,auVar231);
            auVar222 = vmaxss_avx512f(auVar220,auVar228);
            auVar233 = in_ZMM28._0_16_;
            auVar234 = in_ZMM29._0_16_;
            auVar220 = vsubss_avx512f(auVar233,auVar234);
            auVar236 = in_ZMM31._0_16_;
            auVar220 = vsubss_avx512f(auVar220,auVar236);
            auVar235 = in_ZMM30._0_16_;
            auVar220 = vaddss_avx512f(auVar220,auVar235);
            auVar220 = vmaxss_avx(auVar220,auVar246);
            fVar251 = ((auVar217._0_4_ + auVar219._0_4_) - auVar222._0_4_) - auVar220._0_4_;
            auVar220 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar251 * -0.81)),auVar218,auVar215)
            ;
            pfVar32[iVar182] = auVar220._0_4_ * fVar243 * fVar243;
            pbVar33[iVar182] = 0.0 <= auVar218._0_4_ + auVar215._0_4_;
            iVar182 = iVar182 + 1;
            if ((uVar148 & 2) == 0) {
              fVar247 = 0.0;
              fVar251 = 0.0;
              iVar94 = iVar189 - iVar194;
              if (iVar166 < iVar189 - iVar194) {
                iVar94 = iVar166;
              }
              iVar192 = (iVar8 - iVar194) + iVar189;
              if (iVar166 <= iVar192) {
                iVar192 = iVar166;
              }
              if ((0 < iVar91) && (0 < iVar94)) {
                fVar251 = pfVar38[iVar196 + iVar94 + -1];
              }
              if ((0 < iVar91) && (0 < iVar192)) {
                fVar247 = pfVar38[iVar196 + iVar192 + -1];
              }
              fVar249 = 0.0;
              fVar250 = 0.0;
              if ((0 < iVar133) && (0 < iVar94)) {
                fVar250 = pfVar38[iVar94 + -1 + iVar134];
              }
              if ((0 < iVar133) && (0 < iVar192)) {
                fVar249 = pfVar38[iVar192 + -1 + iVar134];
              }
              auVar215 = vxorps_avx512vl(auVar221,auVar221);
              auVar220 = ZEXT816(0) << 0x40;
              iVar94 = iVar189 - iVar57;
              if (iVar166 < iVar189 - iVar57) {
                iVar94 = iVar166;
              }
              iVar192 = (iVar49 - iVar57) + iVar189;
              if (iVar166 <= iVar192) {
                iVar192 = iVar166;
              }
              if ((0 < iVar91) && (0 < iVar94)) {
                auVar220 = ZEXT416((uint)pfVar38[iVar196 + iVar94 + -1]);
              }
              if ((0 < iVar91) && (0 < iVar192)) {
                auVar216 = ZEXT416((uint)pfVar38[iVar196 + iVar192 + -1]);
              }
              auVar217 = vxorps_avx512vl(auVar224,auVar224);
              auVar218 = vxorps_avx512vl(auVar225,auVar225);
              if ((0 < iVar133) && (0 < iVar94)) {
                auVar218 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar134]);
              }
              if ((0 < iVar133) && (0 < iVar192)) {
                auVar217 = ZEXT416((uint)pfVar38[iVar192 + -1 + iVar134]);
              }
              fVar248 = 0.0;
              iVar94 = -iVar49 + 1 + iVar189;
              if (iVar166 < iVar94) {
                iVar94 = iVar166;
              }
              auVar219 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar247) - fVar250) + fVar249)),
                                        auVar215);
              auVar220 = vsubss_avx512f(auVar220,auVar216);
              iVar192 = iVar49 + iVar189;
              if (iVar166 <= iVar49 + iVar189) {
                iVar192 = iVar166;
              }
              iVar193 = iVar94 + -1;
              auVar220 = vsubss_avx512f(auVar220,auVar218);
              auVar220 = vaddss_avx512f(auVar220,auVar217);
              auVar220 = vmaxss_avx(auVar220,ZEXT816(0) << 0x40);
              auVar220 = vfmadd132ss_fma(auVar220,auVar219,auVar237);
              fVar251 = 0.0;
              if ((0 < iVar79) && (0 < iVar94)) {
                fVar251 = pfVar38[iVar135 + iVar193];
              }
              iVar95 = iVar192 + -1;
              if ((0 < iVar79) && (0 < iVar192)) {
                fVar248 = pfVar38[iVar135 + iVar95];
              }
              fVar250 = 0.0;
              fVar247 = 0.0;
              if ((0 < iVar80) && (0 < iVar94)) {
                fVar247 = pfVar38[iVar136 + iVar193];
              }
              if ((0 < iVar80) && (0 < iVar192)) {
                fVar250 = pfVar38[iVar136 + iVar95];
              }
              auVar216 = vxorps_avx512vl(auVar216,auVar216);
              if ((0 < iVar175) && (0 < iVar94)) {
                auVar216 = ZEXT416((uint)pfVar38[iVar187 + iVar193]);
              }
              auVar217 = vxorps_avx512vl(auVar217,auVar217);
              if ((0 < iVar175) && (0 < iVar192)) {
                auVar217 = ZEXT416((uint)pfVar38[iVar187 + iVar95]);
              }
              auVar218 = vxorps_avx512vl(auVar218,auVar218);
              auVar219 = vxorps_avx512vl(auVar226,auVar226);
              if ((0 < iVar81) && (0 < iVar94)) {
                auVar219 = ZEXT416((uint)pfVar38[iVar193 + iVar137]);
              }
              if ((0 < iVar81) && (0 < iVar192)) {
                auVar218 = ZEXT416((uint)pfVar38[iVar95 + iVar137]);
              }
              fVar249 = 0.0;
              iVar94 = iVar49 + 1 + iVar189;
              if (iVar166 <= iVar94) {
                iVar94 = iVar166;
              }
              auVar221 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar248) - fVar247) + fVar250)),
                                        auVar215);
              auVar222 = vsubss_avx512f(auVar216,auVar217);
              auVar222 = vsubss_avx512f(auVar222,auVar219);
              auVar222 = vaddss_avx512f(auVar222,auVar218);
              auVar222 = vmaxss_avx(auVar222,ZEXT816(0) << 0x40);
              auVar222 = vfmadd132ss_fma(auVar222,auVar221,auVar237);
              fVar251 = 0.0;
              if ((0 < iVar172) && (0 < iVar181)) {
                fVar251 = pfVar38[iVar138 + iVar147];
              }
              iVar192 = iVar94 + -1;
              if ((0 < iVar172) && (0 < iVar94)) {
                fVar249 = pfVar38[iVar138 + iVar192];
              }
              fVar247 = 0.0;
              if (bVar190) {
                auVar215 = ZEXT416((uint)pfVar38[iVar157 + iVar147]);
              }
              if ((0 < iVar62) && (0 < iVar94)) {
                fVar247 = pfVar38[iVar157 + iVar192];
              }
              auVar216 = vxorps_avx512vl(auVar216,auVar216);
              auVar217 = vxorps_avx512vl(auVar217,auVar217);
              iVar193 = -iVar49 + iVar189;
              if (iVar166 < iVar193) {
                iVar193 = iVar166;
              }
              iVar95 = iVar193 + -1;
              if ((0 < iVar63) && (0 < iVar193)) {
                auVar217 = ZEXT416((uint)pfVar38[iVar158 + iVar95]);
              }
              auVar218 = vxorps_avx512vl(auVar218,auVar218);
              if (bVar174) {
                auVar218 = ZEXT416((uint)pfVar38[iVar158 + iVar197]);
              }
              auVar219 = vxorps_avx512vl(auVar219,auVar219);
              auVar221 = vxorps_avx512vl(auVar227,auVar227);
              if ((0 < iVar165) && (0 < iVar193)) {
                auVar221 = ZEXT416((uint)pfVar38[iVar139 + iVar95]);
              }
              if ((0 < iVar165) && (0 < iVar204)) {
                auVar219 = ZEXT416((uint)pfVar38[iVar139 + iVar197]);
              }
              auVar224 = vxorps_avx512vl(auVar229,auVar229);
              if ((0 < iVar172) && (0 < iVar193)) {
                auVar224 = ZEXT416((uint)pfVar38[iVar138 + iVar95]);
              }
              auVar225 = vxorps_avx512vl(auVar230,auVar230);
              if ((0 < iVar172) && (0 < iVar204)) {
                auVar225 = ZEXT416((uint)pfVar38[iVar138 + iVar197]);
              }
              auVar226 = vxorps_avx512vl(auVar231,auVar231);
              auVar227 = vxorps_avx512vl(auVar232,auVar232);
              if ((0 < iVar62) && (0 < iVar193)) {
                auVar227 = ZEXT416((uint)pfVar38[iVar95 + iVar157]);
              }
              if (bVar40 && bVar39) {
                auVar226 = ZEXT416((uint)pfVar38[iVar157 + iVar197]);
              }
              auVar229 = vxorps_avx512vl(auVar233,auVar233);
              if (bVar42 && bVar41) {
                auVar229 = ZEXT416((uint)pfVar38[iVar158 + iVar147]);
              }
              auVar230 = vxorps_avx512vl(auVar234,auVar234);
              if ((0 < iVar63) && (0 < iVar94)) {
                auVar230 = ZEXT416((uint)pfVar38[iVar158 + iVar192]);
              }
              auVar231 = vxorps_avx512vl(auVar235,auVar235);
              auVar232 = vxorps_avx512vl(auVar236,auVar236);
              if ((0 < iVar165) && (0 < iVar181)) {
                auVar232 = ZEXT416((uint)pfVar38[iVar139 + iVar147]);
              }
              if ((0 < iVar165) && (0 < iVar94)) {
                auVar231 = ZEXT416((uint)pfVar38[iVar192 + iVar139]);
              }
              auVar233 = vsubss_avx512f(auVar217,auVar218);
              auVar234 = vsubss_avx512f(ZEXT416((uint)(fVar251 - fVar249)),auVar215);
              auVar233 = vsubss_avx512f(auVar233,auVar221);
              auVar233 = vaddss_avx512f(auVar233,auVar219);
              auVar234 = vmaxss_avx512f(ZEXT416((uint)(auVar234._0_4_ + fVar247)),auVar216);
              auVar235 = vmaxss_avx512f(auVar233,auVar223);
              auVar233 = vsubss_avx512f(auVar224,auVar225);
              auVar233 = vsubss_avx512f(auVar233,auVar227);
              auVar233 = vaddss_avx512f(auVar233,auVar226);
              auVar236 = vmaxss_avx512f(auVar233,auVar228);
              auVar233 = vsubss_avx512f(auVar229,auVar230);
              auVar233 = vsubss_avx512f(auVar233,auVar232);
              auVar233 = vaddss_avx512f(auVar233,auVar231);
              fVar247 = 0.0;
              auVar233 = vmaxss_avx(auVar233,ZEXT816(0) << 0x20);
              fVar251 = ((auVar234._0_4_ + auVar235._0_4_) - auVar236._0_4_) - auVar233._0_4_;
              auVar233 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar251 * -0.81)),auVar220,
                                         auVar222);
              fVar251 = 0.0;
              pfVar34[iVar176] = auVar233._0_4_ * fVar244 * fVar244;
              pbVar35[iVar176] = 0.0 <= auVar220._0_4_ + auVar222._0_4_;
              iVar94 = iVar189 - iVar93;
              if (iVar166 < iVar189 - iVar93) {
                iVar94 = iVar166;
              }
              iVar192 = (iVar9 - iVar93) + iVar189;
              if (iVar166 <= iVar192) {
                iVar192 = iVar166;
              }
              if ((0 < iVar92) && (0 < iVar94)) {
                fVar251 = pfVar38[iVar188 + iVar94 + -1];
              }
              if ((0 < iVar92) && (0 < iVar192)) {
                fVar247 = pfVar38[iVar188 + iVar192 + -1];
              }
              fVar249 = 0.0;
              fVar250 = 0.0;
              if ((0 < iVar140) && (0 < iVar94)) {
                fVar250 = pfVar38[iVar94 + -1 + iVar141];
              }
              if ((0 < iVar140) && (0 < iVar192)) {
                fVar249 = pfVar38[iVar192 + -1 + iVar141];
              }
              auVar215 = vxorps_avx512vl(auVar215,auVar215);
              in_ZMM16 = ZEXT1664(auVar215);
              auVar234._0_12_ = ZEXT812(0);
              auVar234._12_4_ = 0;
              iVar94 = iVar189 - iVar58;
              if (iVar166 < iVar189 - iVar58) {
                iVar94 = iVar166;
              }
              iVar192 = (iVar50 - iVar58) + iVar189;
              if (iVar166 <= iVar192) {
                iVar192 = iVar166;
              }
              if ((0 < iVar92) && (0 < iVar94)) {
                auVar234 = ZEXT416((uint)pfVar38[iVar188 + iVar94 + -1]);
              }
              if ((0 < iVar92) && (0 < iVar192)) {
                auVar216 = ZEXT416((uint)pfVar38[iVar188 + iVar192 + -1]);
              }
              auVar220 = vxorps_avx512vl(auVar217,auVar217);
              auVar217 = vxorps_avx512vl(auVar218,auVar218);
              if ((0 < iVar140) && (0 < iVar94)) {
                auVar217 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar141]);
              }
              if ((0 < iVar140) && (0 < iVar192)) {
                auVar220 = ZEXT416((uint)pfVar38[iVar192 + -1 + iVar141]);
              }
              iVar94 = -iVar50 + 1 + iVar189;
              fVar248 = 0.0;
              if (iVar166 < iVar94) {
                iVar94 = iVar166;
              }
              auVar218 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar247) - fVar250) + fVar249)),
                                        auVar215);
              auVar222 = vsubss_avx512f(auVar234,auVar216);
              iVar192 = iVar50 + iVar189;
              if (iVar166 <= iVar50 + iVar189) {
                iVar192 = iVar166;
              }
              iVar193 = iVar94 + -1;
              auVar222 = vsubss_avx512f(auVar222,auVar217);
              auVar222 = vaddss_avx512f(auVar222,auVar220);
              auVar222 = vmaxss_avx(auVar222,ZEXT816(0) << 0x40);
              auVar218 = vfmadd132ss_fma(auVar222,auVar218,auVar237);
              fVar251 = 0.0;
              if ((0 < iVar82) && (0 < iVar94)) {
                fVar251 = pfVar38[iVar142 + iVar193];
              }
              iVar95 = iVar192 + -1;
              if ((0 < iVar82) && (0 < iVar192)) {
                fVar248 = pfVar38[iVar142 + iVar95];
              }
              fVar250 = 0.0;
              fVar247 = 0.0;
              if ((0 < iVar83) && (0 < iVar94)) {
                fVar247 = pfVar38[iVar143 + iVar193];
              }
              if ((0 < iVar83) && (0 < iVar192)) {
                fVar250 = pfVar38[iVar143 + iVar95];
              }
              auVar216 = vxorps_avx512vl(auVar216,auVar216);
              if ((0 < iVar206) && (0 < iVar94)) {
                auVar216 = ZEXT416((uint)pfVar38[iVar97 + iVar193]);
              }
              auVar220 = vxorps_avx512vl(auVar220,auVar220);
              if ((0 < iVar206) && (0 < iVar192)) {
                auVar220 = ZEXT416((uint)pfVar38[iVar97 + iVar95]);
              }
              auVar217 = vxorps_avx512vl(auVar217,auVar217);
              auVar219 = vxorps_avx512vl(auVar219,auVar219);
              if ((0 < iVar84) && (0 < iVar94)) {
                auVar219 = ZEXT416((uint)pfVar38[iVar193 + iVar144]);
              }
              if ((0 < iVar84) && (0 < iVar192)) {
                auVar217 = ZEXT416((uint)pfVar38[iVar95 + iVar144]);
              }
              fVar249 = 0.0;
              iVar94 = iVar50 + 1 + iVar189;
              if (iVar166 <= iVar94) {
                iVar94 = iVar166;
              }
              auVar222 = vmaxss_avx512f(ZEXT416((uint)(((fVar251 - fVar248) - fVar247) + fVar250)),
                                        auVar215);
              auVar215 = vsubss_avx512f(auVar216,auVar220);
              auVar215 = vsubss_avx512f(auVar215,auVar219);
              auVar215 = vaddss_avx512f(auVar215,auVar217);
              auVar215 = vmaxss_avx(auVar215,ZEXT816(0) << 0x40);
              auVar215 = vfmadd132ss_fma(auVar215,auVar222,auVar237);
              fVar251 = 0.0;
              if ((0 < iVar173) && (0 < iVar181)) {
                fVar251 = pfVar38[iVar145 + iVar147];
              }
              iVar192 = iVar94 + -1;
              if ((0 < iVar173) && (0 < iVar94)) {
                fVar249 = pfVar38[iVar145 + iVar192];
              }
              fVar247 = 0.0;
              if (bVar190) {
                in_ZMM16 = ZEXT464((uint)pfVar38[iVar157 + iVar147]);
              }
              if ((0 < iVar62) && (0 < iVar94)) {
                fVar247 = pfVar38[iVar157 + iVar192];
              }
              auVar216 = vxorps_avx512vl(auVar216,auVar216);
              auVar220 = vxorps_avx512vl(auVar220,auVar220);
              in_ZMM18 = ZEXT1664(auVar220);
              iVar193 = -iVar50 + iVar189;
              if (iVar166 < iVar193) {
                iVar193 = iVar166;
              }
              iVar95 = iVar193 + -1;
              if ((0 < iVar63) && (0 < iVar193)) {
                in_ZMM18 = ZEXT464((uint)pfVar38[iVar158 + iVar95]);
              }
              auVar220 = vxorps_avx512vl(auVar217,auVar217);
              in_ZMM19 = ZEXT1664(auVar220);
              if (bVar174) {
                in_ZMM19 = ZEXT464((uint)pfVar38[iVar158 + iVar197]);
              }
              auVar220 = vxorps_avx512vl(auVar219,auVar219);
              in_ZMM20 = ZEXT1664(auVar220);
              auVar220 = vxorps_avx512vl(auVar221,auVar221);
              in_ZMM21 = ZEXT1664(auVar220);
              if ((0 < iVar12) && (0 < iVar193)) {
                in_ZMM21 = ZEXT464((uint)pfVar38[iVar146 + iVar95]);
              }
              if ((0 < iVar12) && (0 < iVar204)) {
                in_ZMM20 = ZEXT464((uint)pfVar38[iVar146 + iVar197]);
              }
              auVar220 = vxorps_avx512vl(auVar224,auVar224);
              in_ZMM23 = ZEXT1664(auVar220);
              if ((0 < iVar173) && (0 < iVar193)) {
                in_ZMM23 = ZEXT464((uint)pfVar38[iVar145 + iVar95]);
              }
              auVar220 = vxorps_avx512vl(auVar225,auVar225);
              in_ZMM24 = ZEXT1664(auVar220);
              if ((0 < iVar173) && (0 < iVar204)) {
                in_ZMM24 = ZEXT464((uint)pfVar38[iVar145 + iVar197]);
              }
              auVar220 = vxorps_avx512vl(auVar226,auVar226);
              in_ZMM25 = ZEXT1664(auVar220);
              auVar220 = vxorps_avx512vl(auVar227,auVar227);
              in_ZMM26 = ZEXT1664(auVar220);
              if ((0 < iVar62) && (0 < iVar193)) {
                in_ZMM26 = ZEXT464((uint)pfVar38[iVar95 + iVar157]);
              }
              if (bVar40 && bVar39) {
                in_ZMM25 = ZEXT464((uint)pfVar38[iVar197 + iVar157]);
              }
              auVar220 = vxorps_avx512vl(auVar229,auVar229);
              in_ZMM28 = ZEXT1664(auVar220);
              if (bVar42 && bVar41) {
                in_ZMM28 = ZEXT464((uint)pfVar38[iVar158 + iVar147]);
              }
              auVar220 = vxorps_avx512vl(auVar230,auVar230);
              in_ZMM29 = ZEXT1664(auVar220);
              if ((0 < iVar63) && (0 < iVar94)) {
                in_ZMM29 = ZEXT464((uint)pfVar38[iVar158 + iVar192]);
              }
              auVar220 = vxorps_avx512vl(auVar231,auVar231);
              in_ZMM30 = ZEXT1664(auVar220);
              auVar220 = vxorps_avx512vl(auVar232,auVar232);
              in_ZMM31 = ZEXT1664(auVar220);
              if ((0 < iVar12) && (0 < iVar181)) {
                in_ZMM31 = ZEXT464((uint)pfVar38[iVar147 + iVar146]);
              }
              if ((0 < iVar12) && (0 < iVar94)) {
                in_ZMM30 = ZEXT464((uint)pfVar38[iVar192 + iVar146]);
              }
              auVar220 = vsubss_avx512f(in_ZMM18._0_16_,in_ZMM19._0_16_);
              auVar217 = vsubss_avx512f(ZEXT416((uint)(fVar251 - fVar249)),in_ZMM16._0_16_);
              auVar220 = vsubss_avx512f(auVar220,in_ZMM21._0_16_);
              auVar220 = vaddss_avx512f(auVar220,in_ZMM20._0_16_);
              auVar217 = vmaxss_avx512f(ZEXT416((uint)(auVar217._0_4_ + fVar247)),auVar216);
              auVar219 = vmaxss_avx512f(auVar220,auVar223);
              auVar220 = vsubss_avx512f(in_ZMM23._0_16_,in_ZMM24._0_16_);
              auVar220 = vsubss_avx512f(auVar220,in_ZMM26._0_16_);
              auVar220 = vaddss_avx512f(auVar220,in_ZMM25._0_16_);
              auVar237 = vmaxss_avx512f(auVar220,auVar228);
              auVar220 = vsubss_avx512f(in_ZMM28._0_16_,in_ZMM29._0_16_);
              auVar220 = vsubss_avx512f(auVar220,in_ZMM31._0_16_);
              auVar220 = vaddss_avx512f(auVar220,in_ZMM30._0_16_);
              auVar220 = vmaxss_avx(auVar220,auVar246);
              fVar251 = ((auVar217._0_4_ + auVar219._0_4_) - auVar237._0_4_) - auVar220._0_4_;
              auVar220 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar251 * -0.81)),auVar218,
                                         auVar215);
              pfVar36[iVar176] = auVar220._0_4_ * fVar245 * fVar245;
              pbVar37[iVar176] = 0.0 <= auVar218._0_4_ + auVar215._0_4_;
              iVar176 = iVar176 + 1;
            }
          }
          in_ZMM17 = ZEXT1664(auVar216);
          iVar189 = iVar189 + iVar10;
          lVar208 = lVar208 + 1;
        } while (iVar11 != (int)lVar208);
        local_690 = local_690 + (int)lVar208;
      }
      local_734 = local_734 + 1;
    } while (local_734 != uVar1);
  }
  return;
}

Assistant:

void compute_response_layers_at_once(struct fasthessian* fh) {
    /*
    TODO: (valentin) add index precomputation as in compute_response_layer_precompute

    optimizations:
        - precompute inv_area_squared as in compute_response_layer_precompute
        - computes all 8 response layers at once, gives same results as base implementation


    Results:
        - slower than before :(
        - valgrind reports no improvement for l1 misses, i.e. locality is not improved as expected
            guess due to different filter sizes always accesing different cachelines
            need to be smarter about computation order to gain benefit (i.e. same mem addresses are actually accessed at once)
    */
    float Dxx0, Dyy0, Dxy0;
    float Dxx1, Dyy1, Dxy1;
    float Dxx2, Dyy2, Dxy2;
    float Dxx3, Dyy3, Dxy3;
    float Dxx4, Dyy4, Dxy4;
    float Dxx5, Dyy5, Dxy5;
    float Dxx6, Dyy6, Dxy6;
    float Dxx7, Dyy7, Dxy7;

    int x, y;
    int step = fh->step;
    struct integral_image* iimage = fh->iimage;

    // step == 1: 0,1,2,3
    // step == 2: 4,5
    // step == 4: 6,7

    struct response_layer *layer0 = fh->response_map[0];  // step0 == step
    struct response_layer *layer1 = fh->response_map[1];  // step1 == step
    struct response_layer *layer2 = fh->response_map[2];  // step2 == step
    struct response_layer *layer3 = fh->response_map[3];  // step3 == step

    struct response_layer *layer4 = fh->response_map[4];  // step4 == 2*step
    struct response_layer *layer5 = fh->response_map[5];  // step5 == 2*step

    struct response_layer *layer6 = fh->response_map[6];  // step6 == 4*step
    struct response_layer *layer7 = fh->response_map[7];  // step7 == 4*step

    float *response0 = layer0->response;
    float *response1 = layer1->response;
    float *response2 = layer2->response;
    float *response3 = layer3->response;
    float *response4 = layer4->response;
    float *response5 = layer5->response;
    float *response6 = layer6->response;
    float *response7 = layer7->response;

    bool *laplacian0 = layer0->laplacian;
    bool *laplacian1 = layer1->laplacian;
    bool *laplacian2 = layer2->laplacian;
    bool *laplacian3 = layer3->laplacian;
    bool *laplacian4 = layer4->laplacian;
    bool *laplacian5 = layer5->laplacian;
    bool *laplacian6 = layer6->laplacian;
    bool *laplacian7 = layer7->laplacian;

    int filter_size0 = layer0->filter_size;
    int filter_size1 = layer1->filter_size;
    int filter_size2 = layer2->filter_size;
    int filter_size3 = layer3->filter_size;
    int filter_size4 = layer4->filter_size;
    int filter_size5 = layer5->filter_size;
    int filter_size6 = layer6->filter_size;
    int filter_size7 = layer7->filter_size;

    int height = layer0->height;
    int width = layer0->width;

    int lobe0 = filter_size0/3;
    int lobe1 = filter_size1/3;
    int lobe2 = filter_size2/3;
    int lobe3 = filter_size3/3;
    int lobe4 = filter_size4/3;
    int lobe5 = filter_size5/3;
    int lobe6 = filter_size6/3;
    int lobe7 = filter_size7/3;

    int border0 = (filter_size0-1)/2;
    int border1 = (filter_size1-1)/2;
    int border2 = (filter_size2-1)/2;
    int border3 = (filter_size3-1)/2;
    int border4 = (filter_size4-1)/2;
    int border5 = (filter_size5-1)/2;
    int border6 = (filter_size6-1)/2;
    int border7 = (filter_size7-1)/2;

    float inv_area0 = 1.f/(filter_size0*filter_size0);
    float inv_area1 = 1.f/(filter_size1*filter_size1);
    float inv_area2 = 1.f/(filter_size2*filter_size2);
    float inv_area3 = 1.f/(filter_size3*filter_size3);
    float inv_area4 = 1.f/(filter_size4*filter_size4);
    float inv_area5 = 1.f/(filter_size5*filter_size5);
    float inv_area6 = 1.f/(filter_size6*filter_size6);
    float inv_area7 = 1.f/(filter_size7*filter_size7);

    float inv_area_squared0 = (inv_area0*inv_area0);
    float inv_area_squared1 = (inv_area1*inv_area1);
    float inv_area_squared2 = (inv_area2*inv_area2);
    float inv_area_squared3 = (inv_area3*inv_area3);
    float inv_area_squared4 = (inv_area4*inv_area4);
    float inv_area_squared5 = (inv_area5*inv_area5);
    float inv_area_squared6 = (inv_area6*inv_area6);
    float inv_area_squared7 = (inv_area7*inv_area7);


    for (int i = 0, ind = 0, ind2 = 0, ind4 = 0; i < height; ++i) {
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            x = i * step;
            y = j * step;

            // layer0
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx0 = box_integral(iimage, x - lobe0 + 1, y - border0, 2 * lobe0 - 1, filter_size0) -
                   3 * box_integral(iimage, x - lobe0 + 1, y - lobe0 / 2, 2 * lobe0 - 1, lobe0);
            Dyy0 = box_integral(iimage, x - border0, y - lobe0 + 1, filter_size0, 2 * lobe0 - 1) -
                   3 * box_integral(iimage, x - lobe0 / 2, y - lobe0 + 1, lobe0, 2 * lobe0 - 1);
            Dxy0 = box_integral(iimage, x - lobe0, y + 1, lobe0, lobe0) +
                   box_integral(iimage, x + 1, y - lobe0, lobe0, lobe0) -
                   box_integral(iimage, x - lobe0, y - lobe0, lobe0, lobe0) -
                   box_integral(iimage, x + 1, y + 1, lobe0, lobe0);

            // Normalize Responses with inverse area
            // Dxx0 *= inv_area0;
            // Dyy0 *= inv_area0;
            // Dxy0 *= inv_area0;

            // Calculate Determinant
            response0[ind] = inv_area_squared0*(Dxx0 * Dyy0 - 0.81f * Dxy0 * Dxy0);

            // Calculate Laplacian
            laplacian0[ind] = (Dxx0 + Dyy0 >= 0 ? true : false);


            // layer1
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx1 = box_integral(iimage, x - lobe1 + 1, y - border1, 2 * lobe1 - 1, filter_size1) -
                   3 * box_integral(iimage, x - lobe1 + 1, y - lobe1 / 2, 2 * lobe1 - 1, lobe1);
            Dyy1 = box_integral(iimage, x - border1, y - lobe1 + 1, filter_size1, 2 * lobe1 - 1) -
                   3 * box_integral(iimage, x - lobe1 / 2, y - lobe1 + 1, lobe1, 2 * lobe1 - 1);
            Dxy1 = box_integral(iimage, x - lobe1, y + 1, lobe1, lobe1) +
                   box_integral(iimage, x + 1, y - lobe1, lobe1, lobe1) -
                   box_integral(iimage, x - lobe1, y - lobe1, lobe1, lobe1) -
                   box_integral(iimage, x + 1, y + 1, lobe1, lobe1);

            // Normalize Responses with inverse area
            // Dxx1 *= inv_area1;
            // Dyy1 *= inv_area1;
            // Dxy1 *= inv_area1;

            // Calculate Determinant
            response1[ind] = inv_area_squared1*(Dxx1 * Dyy1 - 0.81f * Dxy1 * Dxy1);

            // Calculate Laplacian
            laplacian1[ind] = (Dxx1 + Dyy1 >= 0 ? true : false);


            // layer2
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx2 = box_integral(iimage, x - lobe2 + 1, y - border2, 2 * lobe2 - 1, filter_size2) -
                   3 * box_integral(iimage, x - lobe2 + 1, y - lobe2 / 2, 2 * lobe2 - 1, lobe2);
            Dyy2 = box_integral(iimage, x - border2, y - lobe2 + 1, filter_size2, 2 * lobe2 - 1) -
                   3 * box_integral(iimage, x - lobe2 / 2, y - lobe2 + 1, lobe2, 2 * lobe2 - 1);
            Dxy2 = box_integral(iimage, x - lobe2, y + 1, lobe2, lobe2) +
                   box_integral(iimage, x + 1, y - lobe2, lobe2, lobe2) -
                   box_integral(iimage, x - lobe2, y - lobe2, lobe2, lobe2) -
                   box_integral(iimage, x + 1, y + 1, lobe2, lobe2);

            // Normalize Responses with inverse area
            // Dxx2 *= inv_area2;
            // Dyy2 *= inv_area2;
            // Dxy2 *= inv_area2;

            // Calculate Determinant
            response2[ind] = inv_area_squared2*(Dxx2 * Dyy2 - 0.81f * Dxy2 * Dxy2);

            // Calculate Laplacian
            laplacian2[ind] = (Dxx2 + Dyy2 >= 0 ? true : false);


            // layer3
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx3 = box_integral(iimage, x - lobe3 + 1, y - border3, 2*lobe3 - 1, filter_size3)
                    - 3 * box_integral(iimage, x - lobe3 + 1, y - lobe3 / 2, 2*lobe3 - 1, lobe3);
            Dyy3 = box_integral(iimage, x - border3, y - lobe3 + 1, filter_size3, 2*lobe3 - 1)
                    - 3 * box_integral(iimage, x - lobe3 / 2, y - lobe3 + 1, lobe3, 2*lobe3 - 1);
            Dxy3 = box_integral(iimage, x - lobe3, y + 1, lobe3, lobe3)
                    + box_integral(iimage, x + 1, y - lobe3, lobe3, lobe3)
                    - box_integral(iimage, x - lobe3, y - lobe3, lobe3, lobe3)
                    - box_integral(iimage, x + 1, y + 1, lobe3, lobe3);

            // Normalize Responses with inverse area
            // Dxx3 *= inv_area3;
            // Dyy3 *= inv_area3;
            // Dxy3 *= inv_area3;

            // Calculate Determinant
            response3[ind] = inv_area_squared3*(Dxx3 * Dyy3 - 0.81f * Dxy3 * Dxy3);

            // Calculate Laplacian
            laplacian3[ind] = (Dxx3 + Dyy3 >= 0 ? true : false);


            // 2*step
            if (i % 2 == 0 && j % 2 == 0) {
                // layer4
                // Calculate Dxx, Dyy, Dxy with Box Filter
                Dxx4 = box_integral(iimage, x - lobe4 + 1, y - border4, 2*lobe4 - 1, filter_size4)
                        - 3 * box_integral(iimage, x - lobe4 + 1, y - lobe4 / 2, 2*lobe4 - 1, lobe4);
                Dyy4 = box_integral(iimage, x - border4, y - lobe4 + 1, filter_size4, 2*lobe4 - 1)
                        - 3 * box_integral(iimage, x - lobe4 / 2, y - lobe4 + 1, lobe4, 2*lobe4 - 1);
                Dxy4 = box_integral(iimage, x - lobe4, y + 1, lobe4, lobe4)
                        + box_integral(iimage, x + 1, y - lobe4, lobe4, lobe4)
                        - box_integral(iimage, x - lobe4, y - lobe4, lobe4, lobe4)
                        - box_integral(iimage, x + 1, y + 1, lobe4, lobe4);

                // Normalize Responses with inverse area
                // Dxx4 *= inv_area4;
                // Dyy4 *= inv_area4;
                // Dxy4 *= inv_area4;

                // Calculate Determinant
                response4[ind2] = inv_area_squared4*(Dxx4 * Dyy4 - 0.81f * Dxy4 * Dxy4);

                // Calculate Laplacian
                laplacian4[ind2] = (Dxx4 + Dyy4 >= 0 ? true : false);


                // layer5
                // Calculate Dxx, Dyy, Dxy with Box Filter
                Dxx5 = box_integral(iimage, x - lobe5 + 1, y - border5, 2*lobe5 - 1, filter_size5)
                        - 3 * box_integral(iimage, x - lobe5 + 1, y - lobe5 / 2, 2*lobe5 - 1, lobe5);
                Dyy5 = box_integral(iimage, x - border5, y - lobe5 + 1, filter_size5, 2*lobe5 - 1)
                        - 3 * box_integral(iimage, x - lobe5 / 2, y - lobe5 + 1, lobe5, 2*lobe5 - 1);
                Dxy5 = box_integral(iimage, x - lobe5, y + 1, lobe5, lobe5)
                        + box_integral(iimage, x + 1, y - lobe5, lobe5, lobe5)
                        - box_integral(iimage, x - lobe5, y - lobe5, lobe5, lobe5)
                        - box_integral(iimage, x + 1, y + 1, lobe5, lobe5);

                // Normalize Responses with inverse area
                // Dxx5 *= inv_area5;
                // Dyy5 *= inv_area5;
                // Dxy5 *= inv_area5;

                // Calculate Determinant
                response5[ind2] = inv_area_squared5*(Dxx5 * Dyy5 - 0.81f * Dxy5 * Dxy5);

                // Calculate Laplacian
                laplacian5[ind2] = (Dxx5 + Dyy5 >= 0 ? true : false);


                ind2++;

                // 4*step
                if (i % 4 == 0 && j % 4 == 0) {
                    // layer6
                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    Dxx6 = box_integral(iimage, x - lobe6 + 1, y - border6, 2*lobe6 - 1, filter_size6)
                            - 3 * box_integral(iimage, x - lobe6 + 1, y - lobe6 / 2, 2*lobe6 - 1, lobe6);
                    Dyy6 = box_integral(iimage, x - border6, y - lobe6 + 1, filter_size6, 2*lobe6 - 1)
                            - 3 * box_integral(iimage, x - lobe6 / 2, y - lobe6 + 1, lobe6, 2*lobe6 - 1);
                    Dxy6 = box_integral(iimage, x - lobe6, y + 1, lobe6, lobe6)
                            + box_integral(iimage, x + 1, y - lobe6, lobe6, lobe6)
                            - box_integral(iimage, x - lobe6, y - lobe6, lobe6, lobe6)
                            - box_integral(iimage, x + 1, y + 1, lobe6, lobe6);

                    // Normalize Responses with inverse area
                    // Dxx6 *= inv_area6;
                    // Dyy6 *= inv_area6;
                    // Dxy6 *= inv_area6;

                    // Calculate Determinant
                    response6[ind4] = inv_area_squared6*(Dxx6 * Dyy6 - 0.81f * Dxy6 * Dxy6);

                    // Calculate Laplacian
                    laplacian6[ind4] = (Dxx6 + Dyy6 >= 0 ? true : false);


                    // layer7
                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    Dxx7 = box_integral(iimage, x - lobe7 + 1, y - border7, 2*lobe7 - 1, filter_size7)
                            - 3 * box_integral(iimage, x - lobe7 + 1, y - lobe7 / 2, 2*lobe7 - 1, lobe7);
                    Dyy7 = box_integral(iimage, x - border7, y - lobe7 + 1, filter_size7, 2*lobe7 - 1)
                            - 3 * box_integral(iimage, x - lobe7 / 2, y - lobe7 + 1, lobe7, 2*lobe7 - 1);
                    Dxy7 = box_integral(iimage, x - lobe7, y + 1, lobe7, lobe7)
                            + box_integral(iimage, x + 1, y - lobe7, lobe7, lobe7)
                            - box_integral(iimage, x - lobe7, y - lobe7, lobe7, lobe7)
                            - box_integral(iimage, x + 1, y + 1, lobe7, lobe7);

                    // Normalize Responses with inverse area
                    // Dxx7 *= inv_area7;
                    // Dyy7 *= inv_area7;
                    // Dxy7 *= inv_area7;

                    // Calculate Determinant
                    response7[ind4] = inv_area_squared7*(Dxx7 * Dyy7 - 0.81f * Dxy7 * Dxy7);

                    // Calculate Laplacian
                    laplacian7[ind4] = (Dxx7 + Dyy7 >= 0 ? true : false);


                    ind4++;
                }
            }

            // template for search and replace J to layer number
            // // layerJ
            // // Calculate Dxx, Dyy, Dxy with Box Filter
            // DxxJ = box_integral(iimage, x - lobeJ + 1, y - borderJ, 2*lobeJ - 1, filter_sizeJ)
            //         - 3 * box_integral(iimage, x - lobeJ + 1, y - lobeJ / 2, 2*lobeJ - 1, lobeJ);
            // DyyJ = box_integral(iimage, x - borderJ, y - lobeJ + 1, filter_sizeJ, 2*lobeJ - 1)
            //         - 3 * box_integral(iimage, x - lobeJ / 2, y - lobeJ + 1, lobeJ, 2*lobeJ - 1);
            // DxyJ = box_integral(iimage, x - lobeJ, y + 1, lobeJ, lobeJ)
            //         + box_integral(iimage, x + 1, y - lobeJ, lobeJ, lobeJ)
            //         - box_integral(iimage, x - lobeJ, y - lobeJ, lobeJ, lobeJ)
            //         - box_integral(iimage, x + 1, y + 1, lobeJ, lobeJ);

            // // Normalize Responses with inverse area
            // DxxJ *= inv_areaJ;
            // DyyJ *= inv_areaJ;
            // DxyJ *= inv_areaJ;

            // // Calculate Determinant
            // responseJ[ind] = DxxJ * DyyJ - 0.81f * DxyJ * DxyJ;

            // // Calculate Laplacian
            // laplacianJ[ind] = (DxxJ + DyyJ >= 0 ? true : false);
        }
    }

}